

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  _func_int **pp_Var15;
  size_t sVar16;
  size_t sVar17;
  _func_int **pp_Var18;
  _func_int *p_Var19;
  Layer *pLVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined4 uVar44;
  undefined4 uVar45;
  Allocator AVar46;
  Allocator AVar47;
  Allocator AVar48;
  Allocator AVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  Mat *pMVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  Allocator *pAVar58;
  void *pvVar59;
  long lVar60;
  void *pvVar61;
  uint uVar62;
  long lVar63;
  long lVar64;
  float *pfVar65;
  int iVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  _func_int *p_Var70;
  int v_2;
  void *pvVar71;
  int i;
  int iVar72;
  int iVar73;
  uint uVar74;
  long lVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  int y;
  uint uVar81;
  ulong uVar82;
  int y_8;
  uint _elempack;
  int iVar83;
  float *pfVar84;
  long lVar85;
  Allocator *pAVar86;
  int i_1;
  long lVar87;
  int iVar88;
  ulong uVar89;
  undefined1 (*pauVar90) [16];
  int iVar91;
  int iVar92;
  float fVar93;
  undefined4 uVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar118 [28];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar119 [28];
  float fVar99;
  float fVar133;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar131;
  float fVar132;
  undefined1 auVar100 [16];
  float fVar134;
  undefined1 auVar120 [32];
  undefined1 auVar101 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar171 [28];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar228;
  float fVar232;
  float fVar233;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 in_ZMM3 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar266;
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  __m128 pos;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar306 [64];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [64];
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  float fVar314;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [64];
  float fVar331;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar342 [64];
  float fVar348;
  float fVar357;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [32];
  float fVar355;
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar382;
  undefined1 auVar375 [32];
  undefined1 auVar376 [64];
  long lStackY_2a0;
  Allocator *local_238;
  Allocator *local_218;
  Allocator *local_210;
  Mat local_1c8;
  ulong local_180;
  int local_178;
  int local_174;
  _func_int **local_170;
  undefined1 local_168 [32];
  Option *local_148;
  long local_140;
  Mat *local_138;
  Allocator *local_130;
  long local_128;
  ulong local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  float fVar22;
  undefined1 auVar179 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar186 [32];
  undefined1 auVar257 [32];
  undefined1 auVar263 [32];
  undefined1 auVar305 [32];
  
  iVar91 = bottom_blob->w;
  iVar92 = bottom_blob->h;
  uVar68 = bottom_blob->elemsize;
  local_180 = (ulong)bottom_blob->elempack;
  p_Var70 = this->_vptr_Deconvolution_x86_avx[-3];
  uVar12 = *(uint *)(&this->field_0xd0 + (long)p_Var70);
  if (opt->use_packing_layout == true) {
    _elempack = 8;
    if ((uVar12 & 7) != 0) {
      _elempack = (uint)((uVar12 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  local_174 = (*(int *)(&this->field_0xd4 + (long)p_Var70) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var70);
  iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
  local_178 = (*(int *)(&this->field_0xd8 + (long)p_Var70) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var70);
  iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
  iVar73 = *(int *)(&this->field_0xfc + (long)p_Var70);
  iVar83 = *(int *)(&this->field_0x100 + (long)p_Var70);
  uVar79 = (long)(int)uVar12 / (long)(int)_elempack & 0xffffffff;
  local_1c8.cstep = 0;
  local_1c8.data = (Allocator *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1c8.elempack = 0;
  local_1c8.h = 0;
  p_Var70 = this->_vptr_Deconvolution_x86_avx[-3];
  lStackY_2a0 = 0x10;
  local_1c8.allocator = (Allocator *)local_1c8.data;
  local_1c8.dims = (int)local_1c8.refcount;
  local_1c8.w = local_1c8.refcount._4_4_;
  local_1c8.d = (int)local_1c8.refcount;
  local_1c8.c = local_1c8.elempack;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var70) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var70) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var70) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var70) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var70) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var70) < 1)))) &&
     (lStackY_2a0 = 8, &local_1c8 != top_blob)) {
    piVar14 = top_blob->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    lStackY_2a0 = 8;
    local_1c8.data = top_blob->data;
    local_1c8.refcount._0_4_ = (int)top_blob->refcount;
    local_1c8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1c8.elemsize = top_blob->elemsize;
    local_1c8.elempack = top_blob->elempack;
    local_1c8.allocator = top_blob->allocator;
    uVar8 = top_blob->dims;
    uVar9 = top_blob->w;
    uVar10 = top_blob->h;
    uVar11 = top_blob->d;
    local_1c8.c = top_blob->c;
    local_1c8.cstep = top_blob->cstep;
    local_1c8.dims = uVar8;
    local_1c8.w = uVar9;
    local_1c8.h = uVar10;
    local_1c8.d = uVar11;
  }
  iVar88 = (iVar91 + -1) * iVar72 + local_174 + iVar73 + 1;
  iVar73 = (int)((long)(int)uVar12 / (long)(int)_elempack);
  local_148 = opt;
  local_138 = top_blob;
  Mat::create(&local_1c8,iVar88,iVar83 + (iVar92 + -1) * iVar66 + local_178 + 1,iVar73,
              (uVar68 / local_180) * (ulong)_elempack,_elempack,
              *(Allocator **)(&opt->lightmode + lStackY_2a0));
  iVar72 = -100;
  if (((Allocator *)local_1c8.data != (Allocator *)0x0) &&
     (local_1c8.cstep * (long)local_1c8.c != 0)) {
    local_170 = this->_vptr_Deconvolution_x86_avx;
    p_Var70 = local_170[-3];
    uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
    uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
    local_140 = (long)(int)(uVar13 * uVar12);
    if (local_148->use_sgemm_convolution == true) {
      piVar14 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar72 = bottom_blob->h;
      iVar66 = bottom_blob->w;
      uVar44 = bottom_blob->dims;
      uVar45 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
        iVar66 = bottom_blob->w;
        iVar72 = bottom_blob->h;
      }
      local_d8 = 0;
      _local_a0 = CONCAT44(iVar72 * iVar66,uVar44);
      _uStack_98 = CONCAT44(uVar45,1);
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_148->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_148->field_0x1;
      opt_b.num_threads = local_148->num_threads;
      opt_b.workspace_allocator = local_148->workspace_allocator;
      opt_b.openmp_blocktime = local_148->openmp_blocktime;
      opt_b.use_winograd_convolution = local_148->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_148->use_sgemm_convolution;
      opt_b.use_int8_inference = local_148->use_int8_inference;
      opt_b.use_vulkan_compute = local_148->use_vulkan_compute;
      opt_b.use_bf16_storage = local_148->use_bf16_storage;
      opt_b.use_fp16_packed = local_148->use_fp16_packed;
      opt_b.use_fp16_storage = local_148->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_148->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_148->use_int8_packed;
      opt_b.use_int8_storage = local_148->use_int8_storage;
      opt_b.use_int8_arithmetic = local_148->use_int8_arithmetic;
      opt_b.use_packing_layout = local_148->use_packing_layout;
      opt_b.use_shader_pack8 = local_148->use_shader_pack8;
      opt_b.use_subgroup_basic = local_148->use_subgroup_basic;
      opt_b.use_subgroup_vote = local_148->use_subgroup_vote;
      opt_b.use_subgroup_ballot = local_148->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = local_148->use_subgroup_shuffle;
      opt_b.use_image_storage = local_148->use_image_storage;
      opt_b.use_tensor_storage = local_148->use_tensor_storage;
      opt_b.use_reserved_0 = local_148->use_reserved_0;
      opt_b.flush_denormals = local_148->flush_denormals;
      opt_b.use_local_pool_allocator = local_148->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_148->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_148->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_148->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_148->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_148->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_148->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = local_148->use_reserved_7;
      opt_b.use_reserved_8 = local_148->use_reserved_8;
      opt_b.use_reserved_9 = local_148->use_reserved_9;
      opt_b.use_reserved_10 = local_148->use_reserved_10;
      opt_b.use_reserved_11 = local_148->use_reserved_11;
      opt_b.blob_allocator = local_1c8.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      (*this->gemm->_vptr_Layer[7])();
      pp_Var15 = this->_vptr_Deconvolution_x86_avx;
      p_Var70 = pp_Var15[-3];
      lVar75 = (long)(int)((iVar88 * *(int *)(&this->field_0xe8 + (long)p_Var70) -
                           *(int *)(&this->field_0xe4 + (long)p_Var70) * iVar91) * _elempack);
      if (_elempack == 1) {
        if (iVar91 < 1) {
          iVar91 = 0;
        }
        if (iVar92 < 1) {
          iVar92 = 0;
        }
        if (iVar73 < 1) {
          uVar79 = 0;
        }
        lVar63 = (long)local_1c8.h * (long)local_1c8.w;
        pp_Var15 = this->_vptr_Deconvolution_x86_avx;
        pAVar86 = (Allocator *)local_1c8.data;
        for (uVar68 = 0; uVar68 != uVar79; uVar68 = uVar68 + 1) {
          iVar72 = (int)((local_1c8.elemsize * lVar63 + 0xf & 0xfffffffffffffff0) /
                        local_1c8.elemsize);
          if (local_1c8.dims == 4) {
            iVar72 = (int)lVar63;
          }
          p_Var70 = pp_Var15[-3];
          uVar94 = 0;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var70) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var70) *
              *(long *)(&this->field_0x1e8 + (long)p_Var70) != 0)) {
            uVar94 = *(undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var70) + uVar68 * 4);
          }
          pfVar84 = (float *)(uVar68 * iStack_ec * local_108 * local_140 + (long)local_118);
          local_168._0_8_ = uVar68;
          iVar72 = iVar72 * local_1c8.d;
          if (iVar72 < 1) {
            iVar72 = 0;
          }
          for (lVar64 = 0; iVar72 != (int)lVar64; lVar64 = lVar64 + 1) {
            *(undefined4 *)((long)&pAVar86->_vptr_Allocator + lVar64 * 4) = uVar94;
          }
          p_Var70 = pp_Var15[-3];
          for (iVar72 = 0; iVar72 < *(int *)(&this->field_0xd8 + (long)p_Var70); iVar72 = iVar72 + 1
              ) {
            for (iVar66 = 0; iVar66 < *(int *)(&this->field_0xd4 + (long)p_Var70);
                iVar66 = iVar66 + 1) {
              pfVar65 = (float *)((long)(_func_int ***)local_1c8.data +
                                 (long)iVar66 * (long)*(int *)(&this->field_0xdc + (long)p_Var70) *
                                 4 + (long)iVar72 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var70) *
                                     (long)local_1c8.w * local_1c8.elemsize +
                                     local_1c8.cstep * local_1c8.elemsize * uVar68);
              for (iVar73 = 0; iVar83 = iVar91, iVar73 != iVar92; iVar73 = iVar73 + 1) {
                while (iVar83 != 0) {
                  *pfVar65 = *pfVar65 + *pfVar84;
                  p_Var70 = pp_Var15[-3];
                  pfVar65 = pfVar65 + *(int *)(&this->field_0xe4 + (long)p_Var70);
                  pfVar84 = pfVar84 + 1;
                  iVar83 = iVar83 + -1;
                }
                pfVar65 = pfVar65 + lVar75;
              }
            }
          }
          pAVar86 = (Allocator *)
                    ((long)&pAVar86->_vptr_Allocator + local_1c8.cstep * local_1c8.elemsize);
        }
      }
      else if (_elempack == 4) {
        if (iVar91 < 1) {
          iVar91 = 0;
        }
        if (iVar92 < 1) {
          iVar92 = 0;
        }
        if (iVar73 < 1) {
          uVar79 = 0;
        }
        for (uVar68 = 0; uVar68 != uVar79; uVar68 = uVar68 + 1) {
          pfVar84 = (float *)((long)iStack_ec * uVar68 * local_140 * local_108 + (long)local_118);
          pAVar86 = (Allocator *)
                    ((long)(_func_int ***)local_1c8.data +
                    local_1c8.cstep * uVar68 * local_1c8.elemsize);
          uVar78 = (long)local_1c8.h * (long)local_1c8.w;
          uVar89 = (local_1c8.elemsize * uVar78 + 0xf & 0xfffffffffffffff0) / local_1c8.elemsize;
          if (local_1c8.dims == 4) {
            uVar89 = uVar78;
          }
          p_Var70 = pp_Var15[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var70) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var70) *
              *(long *)(&this->field_0x1e8 + (long)p_Var70) == 0)) {
            iVar72 = local_1c8.d * (int)uVar89;
            pAVar58 = pAVar86;
            if (iVar72 < 1) {
              iVar72 = 0;
            }
            while (iVar72 != 0) {
              pAVar58->_vptr_Allocator = (_func_int **)0x0;
              pAVar58[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar58 = pAVar58 + 2;
              iVar72 = iVar72 + -1;
            }
          }
          else {
            auVar188 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1a8 + (long)p_Var70) + uVar68 * 0x10);
            iVar72 = local_1c8.d * (int)uVar89;
            pAVar58 = pAVar86;
            if (iVar72 < 1) {
              iVar72 = 0;
            }
            while (iVar72 != 0) {
              *(undefined1 (*) [16])pAVar58 = auVar188;
              pAVar58 = pAVar58 + 2;
              iVar72 = iVar72 + -1;
            }
          }
          p_Var70 = pp_Var15[-3];
          for (iVar72 = 0; iVar72 < *(int *)(&this->field_0xd8 + (long)p_Var70); iVar72 = iVar72 + 1
              ) {
            for (iVar66 = 0; iVar66 < *(int *)(&this->field_0xd4 + (long)p_Var70);
                iVar66 = iVar66 + 1) {
              pauVar90 = (undefined1 (*) [16])
                         ((long)&pAVar86->_vptr_Allocator +
                         (long)(*(int *)(&this->field_0xdc + (long)p_Var70) * iVar66 * 4) * 4 +
                         (long)iVar72 * (long)*(int *)(&this->field_0xe0 + (long)p_Var70) *
                         local_1c8.elemsize * (long)local_1c8.w);
              for (iVar73 = 0; iVar83 = iVar91, iVar73 != iVar92; iVar73 = iVar73 + 1) {
                while (iVar83 != 0) {
                  auVar117._0_4_ = *pfVar84 + *(float *)*pauVar90;
                  auVar117._4_4_ = pfVar84[1] + *(float *)(*pauVar90 + 4);
                  auVar117._8_4_ = pfVar84[2] + *(float *)(*pauVar90 + 8);
                  auVar117._12_4_ = pfVar84[3] + *(float *)(*pauVar90 + 0xc);
                  *pauVar90 = auVar117;
                  p_Var70 = pp_Var15[-3];
                  pauVar90 = pauVar90 + *(int *)(&this->field_0xe4 + (long)p_Var70);
                  pfVar84 = pfVar84 + 4;
                  iVar83 = iVar83 + -1;
                }
                pauVar90 = (undefined1 (*) [16])(*pauVar90 + lVar75 * 4);
              }
            }
          }
        }
      }
      else if (_elempack == 8) {
        if (iVar91 < 1) {
          iVar91 = 0;
        }
        if (iVar92 < 1) {
          iVar92 = 0;
        }
        if (iVar73 < 1) {
          uVar79 = 0;
        }
        for (uVar68 = 0; uVar68 != uVar79; uVar68 = uVar68 + 1) {
          pfVar84 = (float *)((long)iStack_ec * uVar68 * local_140 * local_108 + (long)local_118);
          pAVar86 = (Allocator *)
                    ((long)(_func_int ***)local_1c8.data +
                    local_1c8.cstep * uVar68 * local_1c8.elemsize);
          uVar78 = (long)local_1c8.h * (long)local_1c8.w;
          uVar89 = (local_1c8.elemsize * uVar78 + 0xf & 0xfffffffffffffff0) / local_1c8.elemsize;
          if (local_1c8.dims == 4) {
            uVar89 = uVar78;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var70) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var70) *
              *(long *)(&this->field_0x1e8 + (long)p_Var70) == 0)) {
            iVar72 = local_1c8.d * (int)uVar89;
            pAVar58 = pAVar86;
            if (iVar72 < 1) {
              iVar72 = 0;
            }
            while (iVar72 != 0) {
              pAVar58->_vptr_Allocator = (_func_int **)0x0;
              pAVar58[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar58[2]._vptr_Allocator = (_func_int **)0x0;
              pAVar58[3]._vptr_Allocator = (_func_int **)0x0;
              pAVar58 = pAVar58 + 4;
              iVar72 = iVar72 + -1;
            }
          }
          else {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var70) + uVar68 * 0x20);
            AVar46._vptr_Allocator = (_func_int **)*plVar1;
            AVar47._vptr_Allocator = (_func_int **)plVar1[1];
            AVar48._vptr_Allocator = (_func_int **)plVar1[2];
            AVar49._vptr_Allocator = (_func_int **)plVar1[3];
            iVar72 = local_1c8.d * (int)uVar89;
            pAVar58 = pAVar86;
            if (iVar72 < 1) {
              iVar72 = 0;
            }
            while (iVar72 != 0) {
              pAVar58->_vptr_Allocator = AVar46._vptr_Allocator;
              pAVar58[1]._vptr_Allocator = AVar47._vptr_Allocator;
              pAVar58[2]._vptr_Allocator = AVar48._vptr_Allocator;
              pAVar58[3]._vptr_Allocator = AVar49._vptr_Allocator;
              pAVar58 = pAVar58 + 4;
              iVar72 = iVar72 + -1;
            }
          }
          p_Var70 = pp_Var15[-3];
          for (iVar72 = 0; iVar72 < *(int *)(&this->field_0xd8 + (long)p_Var70); iVar72 = iVar72 + 1
              ) {
            for (iVar66 = 0; iVar66 < *(int *)(&this->field_0xd4 + (long)p_Var70);
                iVar66 = iVar66 + 1) {
              pfVar65 = (float *)((long)&pAVar86->_vptr_Allocator +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var70) * iVar66 * 8) *
                                 4 + (long)iVar72 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var70) *
                                     local_1c8.elemsize * (long)local_1c8.w);
              for (iVar73 = 0; iVar83 = iVar91, iVar73 != iVar92; iVar73 = iVar73 + 1) {
                while (iVar83 != 0) {
                  fVar93 = pfVar84[1];
                  fVar132 = pfVar84[2];
                  fVar133 = pfVar84[3];
                  fVar99 = pfVar84[4];
                  fVar131 = pfVar84[5];
                  fVar134 = pfVar84[6];
                  fVar231 = pfVar84[7];
                  *pfVar65 = *pfVar84 + *pfVar65;
                  pfVar65[1] = fVar93 + pfVar65[1];
                  pfVar65[2] = fVar132 + pfVar65[2];
                  pfVar65[3] = fVar133 + pfVar65[3];
                  pfVar65[4] = fVar99 + pfVar65[4];
                  pfVar65[5] = fVar131 + pfVar65[5];
                  pfVar65[6] = fVar134 + pfVar65[6];
                  pfVar65[7] = fVar231 + pfVar65[7];
                  p_Var70 = pp_Var15[-3];
                  pfVar65 = pfVar65 + (long)*(int *)(&this->field_0xe4 + (long)p_Var70) * 8;
                  pfVar84 = pfVar84 + 8;
                  iVar83 = iVar83 + -1;
                }
                pfVar65 = pfVar65 + lVar75;
              }
            }
          }
        }
      }
      pLVar20 = this->activation;
      if (pLVar20 != (Layer *)0x0) {
        (*pLVar20->_vptr_Layer[9])(pLVar20,&local_1c8,local_148);
      }
      piVar14 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (((int)local_180 == 8) && (_elempack == 8)) {
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        uVar68 = 0;
        uVar79 = 0;
        if (0 < (int)uVar12) {
          uVar79 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar68;
        }
        auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar332 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar251._8_4_ = 0x3f800000;
        auVar251._0_8_ = 0x3f8000003f800000;
        auVar251._12_4_ = 0x3f800000;
        auVar251._16_4_ = 0x3f800000;
        auVar251._20_4_ = 0x3f800000;
        auVar251._24_4_ = 0x3f800000;
        auVar251._28_4_ = 0x3f800000;
        for (; uVar68 != uVar78; uVar68 = uVar68 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar68 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar62 = 0;
          uVar67 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar67 = 0;
          }
          uVar74 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar74 = 0;
          }
          uVar77 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar77 = 0;
          }
          for (; uVar62 != uVar77; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar81 = 0; uVar81 != uVar74; uVar81 = uVar81 + 1) {
              if (lVar75 == 0) {
                auVar353 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar353 = ZEXT3264(*(undefined1 (*) [32])(lVar75 + uVar68 * 0x20));
              }
              lVar63 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar68 * (this->weight_data_tm).elemsize +
                       0xe0;
              for (uVar69 = 0; uVar69 != uVar67; uVar69 = uVar69 + 1) {
                pvVar59 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar69 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar59;
                lVar64 = lVar63;
                for (uVar82 = 0; uVar82 != uVar89; uVar82 = uVar82 + 1) {
                  iVar54 = (((int)uVar82 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    lVar85 = (long)iVar55 * (long)bottom_blob->w * bottom_blob->elemsize;
                    iVar54 = iVar57;
                    for (lVar87 = 0; uVar79 * 0x100 != lVar87; lVar87 = lVar87 + 0x100) {
                      if (((-1 < iVar54) && (iVar55 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar55 < iVar83)) {
                        lVar60 = (long)(iVar55 << 3);
                        fVar93 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85);
                        fVar132 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 4);
                        fVar133 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 8);
                        fVar99 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0xc);
                        fVar131 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0x10);
                        fVar134 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0x14);
                        fVar231 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0x18);
                        fVar233 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0x1c);
                        pfVar5 = (float *)(lVar64 + -0xe0 + lVar87);
                        pfVar6 = (float *)(lVar64 + -0xc0 + lVar87);
                        pfVar7 = (float *)(lVar64 + -0xa0 + lVar87);
                        pfVar65 = (float *)(lVar64 + -0x80 + lVar87);
                        pfVar2 = (float *)(lVar64 + -0x60 + lVar87);
                        pfVar3 = (float *)(lVar64 + -0x40 + lVar87);
                        fVar232 = fVar133 + fVar99 + fVar133;
                        pfVar4 = (float *)(lVar64 + -0x20 + lVar87);
                        pfVar84 = (float *)(lVar64 + lVar87);
                        fVar187 = fVar231 * *pfVar4 + fVar233 * *pfVar84;
                        fVar226 = fVar231 * pfVar4[1] + fVar233 * pfVar84[1];
                        fVar227 = fVar231 * pfVar4[2] + fVar233 * pfVar84[2];
                        fVar228 = fVar231 * pfVar4[3] + fVar233 * pfVar84[3];
                        fVar229 = fVar231 * pfVar4[4] + fVar233 * pfVar84[4];
                        fVar230 = fVar231 * pfVar4[5] + fVar233 * pfVar84[5];
                        fVar231 = fVar231 * pfVar4[6] + fVar233 * pfVar84[6];
                        fVar233 = fVar232 + fVar133;
                        in_ZMM3 = ZEXT3264(CONCAT428(fVar233,CONCAT424(fVar231,CONCAT420(fVar230,
                                                  CONCAT416(fVar229,CONCAT412(fVar228,CONCAT48(
                                                  fVar227,CONCAT44(fVar226,fVar187))))))));
                        auVar353 = ZEXT3264(CONCAT428(auVar353._28_4_ + fVar93 + fVar132 + fVar133 +
                                                      fVar232 + fVar233,
                                                      CONCAT424(auVar353._24_4_ + fVar93 * pfVar5[6]
                                                                + fVar132 * pfVar6[6] +
                                                                  fVar133 * pfVar7[6] +
                                                                fVar99 * pfVar65[6] +
                                                                fVar131 * pfVar2[6] +
                                                                fVar134 * pfVar3[6] + fVar231,
                                                                CONCAT420(auVar353._20_4_ +
                                                                          fVar93 * pfVar5[5] +
                                                                          fVar132 * pfVar6[5] +
                                                                          fVar133 * pfVar7[5] +
                                                                          fVar99 * pfVar65[5] +
                                                                          fVar131 * pfVar2[5] +
                                                                          fVar134 * pfVar3[5] +
                                                                          fVar230,CONCAT416(auVar353
                                                  ._16_4_ + fVar93 * pfVar5[4] +
                                                  fVar132 * pfVar6[4] + fVar133 * pfVar7[4] +
                                                  fVar99 * pfVar65[4] + fVar131 * pfVar2[4] +
                                                  fVar134 * pfVar3[4] + fVar229,
                                                  CONCAT412(auVar353._12_4_ + fVar93 * pfVar5[3] +
                                                            fVar132 * pfVar6[3] +
                                                            fVar133 * pfVar7[3] +
                                                            fVar99 * pfVar65[3] +
                                                            fVar131 * pfVar2[3] +
                                                            fVar134 * pfVar3[3] + fVar228,
                                                            CONCAT48(auVar353._8_4_ +
                                                                     fVar93 * pfVar5[2] +
                                                                     fVar132 * pfVar6[2] +
                                                                     fVar133 * pfVar7[2] +
                                                                     fVar99 * pfVar65[2] +
                                                                     fVar131 * pfVar2[2] +
                                                                     fVar134 * pfVar3[2] + fVar227,
                                                                     CONCAT44(auVar353._4_4_ +
                                                                              fVar93 * pfVar5[1] +
                                                                              fVar132 * pfVar6[1] +
                                                                              fVar133 * pfVar7[1] +
                                                                              fVar99 * pfVar65[1] +
                                                                              fVar131 * pfVar2[1] +
                                                                              fVar134 * pfVar3[1] +
                                                                              fVar226,auVar353._0_4_
                                                                                      + fVar93 * *
                                                  pfVar5 + fVar132 * *pfVar6 + fVar133 * *pfVar7 +
                                                  fVar99 * *pfVar65 + fVar131 * *pfVar2 +
                                                  fVar134 * *pfVar3 + fVar187))))))));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  lVar64 = lVar64 + (long)(int)uVar12 * 0x100;
                }
                lVar63 = lVar63 + (long)(int)(uVar12 * uVar13 * 0x40) * 4;
              }
              auVar178 = auVar353._0_32_;
              if (5 < iVar73 - 1U) goto LAB_00265de7;
              auVar97 = auVar98._0_32_;
              auVar302 = vmaxps_avx(auVar178,auVar97);
              fVar187 = auVar353._8_4_;
              fVar226 = auVar353._12_4_;
              fVar227 = auVar353._16_4_;
              fVar228 = auVar353._20_4_;
              fVar229 = auVar353._24_4_;
              fVar93 = auVar332._0_4_;
              fVar132 = auVar332._4_4_;
              fVar133 = auVar332._8_4_;
              fVar99 = auVar332._12_4_;
              fVar131 = auVar332._16_4_;
              fVar134 = auVar332._20_4_;
              fVar231 = auVar332._24_4_;
              fVar233 = auVar332._28_4_;
              switch(iVar73) {
              case 2:
                auVar178 = vminps_avx(auVar178,auVar97);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar299._0_4_ = fVar93 * auVar178._0_4_ + auVar302._0_4_;
                auVar299._4_4_ = fVar93 * auVar178._4_4_ + auVar302._4_4_;
                auVar299._8_4_ = fVar93 * auVar178._8_4_ + auVar302._8_4_;
                auVar299._12_4_ = fVar93 * auVar178._12_4_ + auVar302._12_4_;
                auVar299._16_4_ = fVar93 * auVar178._16_4_ + auVar302._16_4_;
                auVar299._20_4_ = fVar93 * auVar178._20_4_ + auVar302._20_4_;
                auVar299._24_4_ = fVar93 * auVar178._24_4_ + auVar302._24_4_;
                auVar299._28_4_ = auVar178._28_4_ + auVar302._28_4_;
                auVar302 = auVar299;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar303._4_4_ = uVar94;
                auVar303._0_4_ = uVar94;
                auVar303._8_4_ = uVar94;
                auVar303._12_4_ = uVar94;
                auVar303._16_4_ = uVar94;
                auVar303._20_4_ = uVar94;
                auVar303._24_4_ = uVar94;
                auVar303._28_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar373._4_4_ = uVar94;
                auVar373._0_4_ = uVar94;
                auVar373._8_4_ = uVar94;
                auVar373._12_4_ = uVar94;
                auVar373._16_4_ = uVar94;
                auVar373._20_4_ = uVar94;
                auVar373._24_4_ = uVar94;
                auVar373._28_4_ = uVar94;
                auVar178 = vmaxps_avx(auVar178,auVar303);
                auVar302 = vminps_avx(auVar373,auVar178);
                break;
              case 4:
                auVar304._0_8_ = auVar353._0_8_ ^ 0x8000000080000000;
                auVar304._8_4_ = -fVar187;
                auVar304._12_4_ = -fVar226;
                auVar304._16_4_ = -fVar227;
                auVar304._20_4_ = -fVar228;
                auVar304._24_4_ = -fVar229;
                auVar304._28_4_ = -auVar353._28_4_;
                auVar175._8_4_ = 0x42b0c0a5;
                auVar175._0_8_ = 0x42b0c0a542b0c0a5;
                auVar175._12_4_ = 0x42b0c0a5;
                auVar175._16_4_ = 0x42b0c0a5;
                auVar175._20_4_ = 0x42b0c0a5;
                auVar175._24_4_ = 0x42b0c0a5;
                auVar175._28_4_ = 0x42b0c0a5;
                auVar178 = vminps_avx(auVar304,auVar175);
                auVar176._8_4_ = 0xc2b0c0a5;
                auVar176._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar176._12_4_ = 0xc2b0c0a5;
                auVar176._16_4_ = 0xc2b0c0a5;
                auVar176._20_4_ = 0xc2b0c0a5;
                auVar176._24_4_ = 0xc2b0c0a5;
                auVar176._28_4_ = 0xc2b0c0a5;
                auVar302 = vmaxps_avx(auVar178,auVar176);
                auVar352._0_4_ = auVar302._0_4_ * 1.442695 + fVar93;
                auVar352._4_4_ = auVar302._4_4_ * 1.442695 + fVar132;
                auVar352._8_4_ = auVar302._8_4_ * 1.442695 + fVar133;
                auVar352._12_4_ = auVar302._12_4_ * 1.442695 + fVar99;
                auVar352._16_4_ = auVar302._16_4_ * 1.442695 + fVar131;
                auVar352._20_4_ = auVar302._20_4_ * 1.442695 + fVar134;
                auVar352._24_4_ = auVar302._24_4_ * 1.442695 + fVar231;
                auVar352._28_4_ = auVar353._28_4_ + fVar233;
                auVar97 = vroundps_avx(auVar352,1);
                auVar178 = vcmpps_avx(auVar352,auVar97,1);
                auVar178 = vandps_avx(auVar178,auVar251);
                auVar178 = vsubps_avx(auVar97,auVar178);
                fVar187 = auVar178._0_4_ * -0.6931472 + auVar302._0_4_;
                fVar226 = auVar178._4_4_ * -0.6931472 + auVar302._4_4_;
                fVar227 = auVar178._8_4_ * -0.6931472 + auVar302._8_4_;
                fVar228 = auVar178._12_4_ * -0.6931472 + auVar302._12_4_;
                fVar229 = auVar178._16_4_ * -0.6931472 + auVar302._16_4_;
                fVar230 = auVar178._20_4_ * -0.6931472 + auVar302._20_4_;
                fVar232 = auVar178._24_4_ * -0.6931472 + auVar302._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar271._0_4_ = (int)auVar178._0_4_;
                auVar271._4_4_ = (int)auVar178._4_4_;
                auVar271._8_4_ = (int)auVar178._8_4_;
                auVar271._12_4_ = (int)auVar178._12_4_;
                auVar305._16_4_ = (int)auVar178._16_4_;
                auVar305._0_16_ = auVar271;
                auVar305._20_4_ = (int)auVar178._20_4_;
                auVar305._24_4_ = (int)auVar178._24_4_;
                auVar305._28_4_ = (int)auVar178._28_4_;
                auVar270 = vpslld_avx(auVar271,0x17);
                auVar188 = vpslld_avx(auVar305._16_16_,0x17);
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = 0x3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar101);
                auVar270 = vpaddd_avx(auVar270,auVar101);
                auVar177._0_4_ =
                     (fVar187 + 1.0 +
                     fVar187 * fVar187 *
                     (fVar93 + ((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452)
                                 * fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187)) *
                     auVar270._0_4_ + 1.0;
                auVar177._4_4_ =
                     (fVar226 + 1.0 +
                     fVar226 * fVar226 *
                     (fVar132 +
                     ((((fVar226 * 0.00019875691 + 0.0013981999) * fVar226 + 0.008333452) * fVar226
                      + 0.041665796) * fVar226 + 0.16666666) * fVar226)) * auVar270._4_4_ + 1.0;
                auVar177._8_4_ =
                     (fVar227 + 1.0 +
                     fVar227 * fVar227 *
                     (fVar133 +
                     ((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                      + 0.041665796) * fVar227 + 0.16666666) * fVar227)) * auVar270._8_4_ + 1.0;
                auVar177._12_4_ =
                     (fVar228 + 1.0 +
                     fVar228 * fVar228 *
                     (fVar99 + ((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452)
                                 * fVar228 + 0.041665796) * fVar228 + 0.16666666) * fVar228)) *
                     auVar270._12_4_ + 1.0;
                auVar177._16_4_ =
                     (fVar229 + 1.0 +
                     fVar229 * fVar229 *
                     (fVar131 +
                     ((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                      + 0.041665796) * fVar229 + 0.16666666) * fVar229)) * auVar188._0_4_ + 1.0;
                auVar177._20_4_ =
                     (fVar230 + 1.0 +
                     fVar230 * fVar230 *
                     (fVar134 +
                     ((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                      + 0.041665796) * fVar230 + 0.16666666) * fVar230)) * auVar188._4_4_ + 1.0;
                auVar177._24_4_ =
                     (fVar232 + 1.0 +
                     fVar232 * fVar232 *
                     (fVar231 +
                     ((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232
                      + 0.041665796) * fVar232 + 0.16666666) * fVar232)) * auVar188._8_4_ + 1.0;
                auVar177._28_4_ =
                     auVar97._28_4_ + auVar302._28_4_ + 1.0 + fVar233 + 0.21826287 + 1.0;
                auVar178 = vrcpps_avx(auVar177);
                fVar93 = auVar178._0_4_;
                fVar132 = auVar178._4_4_;
                auVar33._4_4_ = auVar177._4_4_ * fVar132;
                auVar33._0_4_ = auVar177._0_4_ * fVar93;
                fVar133 = auVar178._8_4_;
                auVar33._8_4_ = auVar177._8_4_ * fVar133;
                fVar99 = auVar178._12_4_;
                auVar33._12_4_ = auVar177._12_4_ * fVar99;
                fVar131 = auVar178._16_4_;
                auVar33._16_4_ = auVar177._16_4_ * fVar131;
                fVar134 = auVar178._20_4_;
                auVar33._20_4_ = auVar177._20_4_ * fVar134;
                fVar231 = auVar178._24_4_;
                auVar33._24_4_ = auVar177._24_4_ * fVar231;
                auVar33._28_4_ = auVar177._28_4_;
                auVar97 = vsubps_avx(auVar251,auVar33);
                auVar302._0_4_ = fVar93 + fVar93 * auVar97._0_4_;
                auVar302._4_4_ = fVar132 + fVar132 * auVar97._4_4_;
                auVar302._8_4_ = fVar133 + fVar133 * auVar97._8_4_;
                auVar302._12_4_ = fVar99 + fVar99 * auVar97._12_4_;
                auVar302._16_4_ = fVar131 + fVar131 * auVar97._16_4_;
                auVar302._20_4_ = fVar134 + fVar134 * auVar97._20_4_;
                auVar302._24_4_ = fVar231 + fVar231 * auVar97._24_4_;
                auVar302._28_4_ = auVar178._28_4_ + auVar97._28_4_;
                break;
              case 5:
                auVar312._8_4_ = 0x42b0c0a5;
                auVar312._0_8_ = 0x42b0c0a542b0c0a5;
                auVar312._12_4_ = 0x42b0c0a5;
                auVar312._16_4_ = 0x42b0c0a5;
                auVar312._20_4_ = 0x42b0c0a5;
                auVar312._24_4_ = 0x42b0c0a5;
                auVar312._28_4_ = 0x42b0c0a5;
                auVar178 = vminps_avx(auVar178,auVar312);
                auVar315._8_4_ = 0xc2b0c0a5;
                auVar315._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar315._12_4_ = 0xc2b0c0a5;
                auVar315._16_4_ = 0xc2b0c0a5;
                auVar315._20_4_ = 0xc2b0c0a5;
                auVar315._24_4_ = 0xc2b0c0a5;
                auVar315._28_4_ = 0xc2b0c0a5;
                auVar97 = vmaxps_avx(auVar315,auVar178);
                auVar300._0_4_ = fVar93 + auVar97._0_4_ * 1.442695;
                auVar300._4_4_ = fVar132 + auVar97._4_4_ * 1.442695;
                auVar300._8_4_ = fVar133 + auVar97._8_4_ * 1.442695;
                auVar300._12_4_ = fVar99 + auVar97._12_4_ * 1.442695;
                auVar300._16_4_ = fVar131 + auVar97._16_4_ * 1.442695;
                auVar300._20_4_ = fVar134 + auVar97._20_4_ * 1.442695;
                auVar300._24_4_ = fVar231 + auVar97._24_4_ * 1.442695;
                auVar300._28_4_ = fVar233 + auVar302._28_4_;
                auVar302 = vroundps_avx(auVar300,1);
                auVar178 = vcmpps_avx(auVar300,auVar302,1);
                auVar178 = vandps_avx(auVar178,auVar251);
                auVar178 = vsubps_avx(auVar302,auVar178);
                auVar30._4_4_ = auVar178._4_4_ * 0.6931472;
                auVar30._0_4_ = auVar178._0_4_ * 0.6931472;
                auVar30._8_4_ = auVar178._8_4_ * 0.6931472;
                auVar30._12_4_ = auVar178._12_4_ * 0.6931472;
                auVar30._16_4_ = auVar178._16_4_ * 0.6931472;
                auVar30._20_4_ = auVar178._20_4_ * 0.6931472;
                auVar30._24_4_ = auVar178._24_4_ * 0.6931472;
                auVar30._28_4_ = auVar302._28_4_;
                auVar302 = vsubps_avx(auVar97,auVar30);
                fVar230 = auVar302._0_4_;
                fVar232 = auVar302._4_4_;
                fVar377 = auVar302._8_4_;
                fVar378 = auVar302._12_4_;
                fVar379 = auVar302._16_4_;
                fVar380 = auVar302._20_4_;
                fVar381 = auVar302._24_4_;
                auVar188._0_4_ = (int)auVar178._0_4_;
                auVar188._4_4_ = (int)auVar178._4_4_;
                auVar188._8_4_ = (int)auVar178._8_4_;
                auVar188._12_4_ = (int)auVar178._12_4_;
                auVar215._16_4_ = (int)auVar178._16_4_;
                auVar215._0_16_ = auVar188;
                auVar215._20_4_ = (int)auVar178._20_4_;
                auVar215._24_4_ = (int)auVar178._24_4_;
                auVar215._28_4_ = (int)auVar178._28_4_;
                auVar270 = vpslld_avx(auVar188,0x17);
                auVar188 = vpslld_avx(auVar215._16_16_,0x17);
                auVar100._8_4_ = 0x3f800000;
                auVar100._0_8_ = 0x3f8000003f800000;
                auVar100._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar270 = vpaddd_avx(auVar270,auVar100);
                auVar301._0_4_ =
                     (fVar230 + 1.0 +
                     fVar230 * fVar230 *
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar93)) * auVar270._0_4_
                     + 1.0;
                auVar301._4_4_ =
                     (fVar232 + 1.0 +
                     fVar232 * fVar232 *
                     (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232
                       + 0.041665796) * fVar232 + 0.16666666) * fVar232 + fVar132)) * auVar270._4_4_
                     + 1.0;
                auVar301._8_4_ =
                     (fVar377 + 1.0 +
                     fVar377 * fVar377 *
                     (((((fVar377 * 0.00019875691 + 0.0013981999) * fVar377 + 0.008333452) * fVar377
                       + 0.041665796) * fVar377 + 0.16666666) * fVar377 + fVar133)) * auVar270._8_4_
                     + 1.0;
                auVar301._12_4_ =
                     (fVar378 + 1.0 +
                     fVar378 * fVar378 *
                     (((((fVar378 * 0.00019875691 + 0.0013981999) * fVar378 + 0.008333452) * fVar378
                       + 0.041665796) * fVar378 + 0.16666666) * fVar378 + fVar99)) * auVar270._12_4_
                     + 1.0;
                auVar301._16_4_ =
                     (fVar379 + 1.0 +
                     fVar379 * fVar379 *
                     (((((fVar379 * 0.00019875691 + 0.0013981999) * fVar379 + 0.008333452) * fVar379
                       + 0.041665796) * fVar379 + 0.16666666) * fVar379 + fVar131)) * auVar188._0_4_
                     + 1.0;
                auVar301._20_4_ =
                     (fVar380 + 1.0 +
                     fVar380 * fVar380 *
                     (((((fVar380 * 0.00019875691 + 0.0013981999) * fVar380 + 0.008333452) * fVar380
                       + 0.041665796) * fVar380 + 0.16666666) * fVar380 + fVar134)) * auVar188._4_4_
                     + 1.0;
                auVar301._24_4_ =
                     (fVar381 + 1.0 +
                     fVar381 * fVar381 *
                     (((((fVar381 * 0.00019875691 + 0.0013981999) * fVar381 + 0.008333452) * fVar381
                       + 0.041665796) * fVar381 + 0.16666666) * fVar381 + fVar231)) * auVar188._8_4_
                     + 1.0;
                auVar301._28_4_ =
                     auVar302._28_4_ + 1.0 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar233 + 1.0;
                auVar172._8_4_ = 0x800000;
                auVar172._0_8_ = 0x80000000800000;
                auVar172._12_4_ = 0x800000;
                auVar172._16_4_ = 0x800000;
                auVar172._20_4_ = 0x800000;
                auVar172._24_4_ = 0x800000;
                auVar172._28_4_ = 0x800000;
                auVar97 = vmaxps_avx(auVar301,auVar172);
                auVar188 = vpsrld_avx(auVar97._16_16_,0x17);
                auVar240._8_4_ = 0x807fffff;
                auVar240._0_8_ = 0x807fffff807fffff;
                auVar240._12_4_ = 0x807fffff;
                auVar240._16_4_ = 0x807fffff;
                auVar240._20_4_ = 0x807fffff;
                auVar240._24_4_ = 0x807fffff;
                auVar240._28_4_ = 0x807fffff;
                auVar178 = vandps_avx(auVar97,auVar240);
                auVar221 = vorps_avx(auVar178,auVar332._0_32_);
                auVar241._8_4_ = 0x3f3504f3;
                auVar241._0_8_ = 0x3f3504f33f3504f3;
                auVar241._12_4_ = 0x3f3504f3;
                auVar241._16_4_ = 0x3f3504f3;
                auVar241._20_4_ = 0x3f3504f3;
                auVar241._24_4_ = 0x3f3504f3;
                auVar241._28_4_ = 0x3f3504f3;
                auVar302 = vcmpps_avx(auVar241,auVar221,2);
                auVar178 = vandnps_avx(auVar302,auVar221);
                fVar230 = auVar221._0_4_ + -1.0 + auVar178._0_4_;
                fVar232 = auVar221._4_4_ + -1.0 + auVar178._4_4_;
                fVar377 = auVar221._8_4_ + -1.0 + auVar178._8_4_;
                fVar378 = auVar221._12_4_ + -1.0 + auVar178._12_4_;
                fVar379 = auVar221._16_4_ + -1.0 + auVar178._16_4_;
                fVar380 = auVar221._20_4_ + -1.0 + auVar178._20_4_;
                fVar381 = auVar221._24_4_ + -1.0 + auVar178._24_4_;
                auVar188 = vpsubd_avx(auVar188,auVar302._16_16_);
                auVar270 = vpsrld_avx(auVar97._0_16_,0x17);
                auVar307._8_4_ = 0xffffff81;
                auVar307._0_8_ = 0xffffff81ffffff81;
                auVar307._12_4_ = 0xffffff81;
                auVar188 = vpaddd_avx(auVar307,auVar188);
                auVar270 = vpsubd_avx(auVar270,auVar302._0_16_);
                auVar270 = vpaddd_avx(auVar307,auVar270);
                auVar173._16_16_ = auVar188;
                auVar173._0_16_ = auVar270;
                auVar302 = vcmpps_avx(auVar301,_DAT_004f2e40,2);
                auVar97 = vcvtdq2ps_avx(auVar173);
                auVar31._4_4_ =
                     (fVar232 + auVar97._4_4_ * 0.6931472 +
                     fVar232 * fVar232 *
                     (fVar232 * (fVar232 * (fVar232 * (fVar232 * (fVar232 * (fVar232 * (fVar232 * (
                                                  fVar232 * (fVar232 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._0_4_ =
                     (fVar230 + auVar97._0_4_ * 0.6931472 +
                     fVar230 * fVar230 *
                     (fVar230 * (fVar230 * (fVar230 * (fVar230 * (fVar230 * (fVar230 * (fVar230 * (
                                                  fVar230 * (fVar230 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._8_4_ =
                     (fVar377 + auVar97._8_4_ * 0.6931472 +
                     fVar377 * fVar377 *
                     (fVar377 * (fVar377 * (fVar377 * (fVar377 * (fVar377 * (fVar377 * (fVar377 * (
                                                  fVar377 * (fVar377 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._12_4_ =
                     (fVar378 + auVar97._12_4_ * 0.6931472 +
                     fVar378 * fVar378 *
                     (fVar378 * (fVar378 * (fVar378 * (fVar378 * (fVar378 * (fVar378 * (fVar378 * (
                                                  fVar378 * (fVar378 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._16_4_ =
                     (fVar379 + auVar97._16_4_ * 0.6931472 +
                     fVar379 * fVar379 *
                     (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (
                                                  fVar379 * (fVar379 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._20_4_ =
                     (fVar380 + auVar97._20_4_ * 0.6931472 +
                     fVar380 * fVar380 *
                     (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (
                                                  fVar380 * (fVar380 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._24_4_ =
                     (fVar381 + auVar97._24_4_ * 0.6931472 +
                     fVar381 * fVar381 *
                     (fVar381 * (fVar381 * (fVar381 * (fVar381 * (fVar381 * (fVar381 * (fVar381 * (
                                                  fVar381 * (fVar381 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar31._28_4_ = auVar221._28_4_ + -1.0 + auVar178._28_4_ + auVar97._28_4_ + 0.0;
                auVar216._8_4_ = 0x7fffffff;
                auVar216._0_8_ = 0x7fffffff7fffffff;
                auVar216._12_4_ = 0x7fffffff;
                auVar216._16_4_ = 0x7fffffff;
                auVar216._20_4_ = 0x7fffffff;
                auVar216._24_4_ = 0x7fffffff;
                auVar216._28_4_ = 0x7fffffff;
                auVar178 = vblendvps_avx(auVar31,auVar216,auVar302);
                auVar217._8_4_ = 0x42b0c0a5;
                auVar217._0_8_ = 0x42b0c0a542b0c0a5;
                auVar217._12_4_ = 0x42b0c0a5;
                auVar217._16_4_ = 0x42b0c0a5;
                auVar217._20_4_ = 0x42b0c0a5;
                auVar217._24_4_ = 0x42b0c0a5;
                auVar217._28_4_ = 0x42b0c0a5;
                auVar178 = vminps_avx(auVar178,auVar217);
                auVar218._8_4_ = 0xc2b0c0a5;
                auVar218._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar218._12_4_ = 0xc2b0c0a5;
                auVar218._16_4_ = 0xc2b0c0a5;
                auVar218._20_4_ = 0xc2b0c0a5;
                auVar218._24_4_ = 0xc2b0c0a5;
                auVar218._28_4_ = 0xc2b0c0a5;
                auVar302 = vmaxps_avx(auVar178,auVar218);
                auVar219._0_4_ = auVar302._0_4_ * 1.442695 + fVar93;
                auVar219._4_4_ = auVar302._4_4_ * 1.442695 + fVar132;
                auVar219._8_4_ = auVar302._8_4_ * 1.442695 + fVar133;
                auVar219._12_4_ = auVar302._12_4_ * 1.442695 + fVar99;
                auVar219._16_4_ = auVar302._16_4_ * 1.442695 + fVar131;
                auVar219._20_4_ = auVar302._20_4_ * 1.442695 + fVar134;
                auVar219._24_4_ = auVar302._24_4_ * 1.442695 + fVar231;
                auVar219._28_4_ = fVar233 + -88.37626;
                auVar97 = vroundps_avx(auVar219,1);
                auVar178 = vcmpps_avx(auVar219,auVar97,1);
                auVar178 = vandps_avx(auVar178,auVar251);
                auVar178 = vsubps_avx(auVar97,auVar178);
                auVar32._4_4_ = auVar178._4_4_ * 0.6931472;
                auVar32._0_4_ = auVar178._0_4_ * 0.6931472;
                auVar32._8_4_ = auVar178._8_4_ * 0.6931472;
                auVar32._12_4_ = auVar178._12_4_ * 0.6931472;
                auVar32._16_4_ = auVar178._16_4_ * 0.6931472;
                auVar32._20_4_ = auVar178._20_4_ * 0.6931472;
                auVar32._24_4_ = auVar178._24_4_ * 0.6931472;
                auVar32._28_4_ = auVar97._28_4_;
                auVar221 = vsubps_avx(auVar302,auVar32);
                fVar230 = auVar221._0_4_;
                fVar232 = auVar221._4_4_;
                fVar377 = auVar221._8_4_;
                fVar378 = auVar221._12_4_;
                fVar379 = auVar221._16_4_;
                fVar380 = auVar221._20_4_;
                fVar381 = auVar221._24_4_;
                auVar98 = ZEXT864(0) << 0x20;
                auVar332 = ZEXT3264(auVar332._0_32_);
                auVar302._0_4_ =
                     fVar93 + ((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) *
                                fVar230 + 0.041665796) * fVar230 + 0.16666666) * fVar230;
                auVar302._4_4_ =
                     fVar132 + ((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452)
                                 * fVar232 + 0.041665796) * fVar232 + 0.16666666) * fVar232;
                auVar302._8_4_ =
                     fVar133 + ((((fVar377 * 0.00019875691 + 0.0013981999) * fVar377 + 0.008333452)
                                 * fVar377 + 0.041665796) * fVar377 + 0.16666666) * fVar377;
                auVar302._12_4_ =
                     fVar99 + ((((fVar378 * 0.00019875691 + 0.0013981999) * fVar378 + 0.008333452) *
                                fVar378 + 0.041665796) * fVar378 + 0.16666666) * fVar378;
                auVar302._16_4_ =
                     fVar131 + ((((fVar379 * 0.00019875691 + 0.0013981999) * fVar379 + 0.008333452)
                                 * fVar379 + 0.041665796) * fVar379 + 0.16666666) * fVar379;
                auVar302._20_4_ =
                     fVar134 + ((((fVar380 * 0.00019875691 + 0.0013981999) * fVar380 + 0.008333452)
                                 * fVar380 + 0.041665796) * fVar380 + 0.16666666) * fVar380;
                auVar302._24_4_ =
                     fVar231 + ((((fVar381 * 0.00019875691 + 0.0013981999) * fVar381 + 0.008333452)
                                 * fVar381 + 0.041665796) * fVar381 + 0.16666666) * fVar381;
                auVar302._28_4_ =
                     fVar233 + auVar301._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 +
                               0.16666666;
                auVar270._0_4_ = (int)auVar178._0_4_;
                auVar270._4_4_ = (int)auVar178._4_4_;
                auVar270._8_4_ = (int)auVar178._8_4_;
                auVar270._12_4_ = (int)auVar178._12_4_;
                auVar220._16_4_ = (int)auVar178._16_4_;
                auVar220._0_16_ = auVar270;
                auVar220._20_4_ = (int)auVar178._20_4_;
                auVar220._24_4_ = (int)auVar178._24_4_;
                auVar220._28_4_ = (int)auVar178._28_4_;
                auVar270 = vpslld_avx(auVar270,0x17);
                auVar188 = vpslld_avx(auVar220._16_16_,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar270 = vpaddd_avx(auVar270,auVar100);
                auVar174._0_4_ =
                     (fVar230 + 1.0 + fVar230 * fVar230 * auVar302._0_4_) * auVar270._0_4_ + 1.0;
                auVar174._4_4_ =
                     (fVar232 + 1.0 + fVar232 * fVar232 * auVar302._4_4_) * auVar270._4_4_ + 1.0;
                auVar174._8_4_ =
                     (fVar377 + 1.0 + fVar377 * fVar377 * auVar302._8_4_) * auVar270._8_4_ + 1.0;
                auVar174._12_4_ =
                     (fVar378 + 1.0 + fVar378 * fVar378 * auVar302._12_4_) * auVar270._12_4_ + 1.0;
                auVar174._16_4_ =
                     (fVar379 + 1.0 + fVar379 * fVar379 * auVar302._16_4_) * auVar188._0_4_ + 1.0;
                auVar174._20_4_ =
                     (fVar380 + 1.0 + fVar380 * fVar380 * auVar302._20_4_) * auVar188._4_4_ + 1.0;
                auVar174._24_4_ =
                     (fVar381 + 1.0 + fVar381 * fVar381 * auVar302._24_4_) * auVar188._8_4_ + 1.0;
                auVar174._28_4_ = auVar221._28_4_ + 1.0 + auVar97._28_4_ + 1.0;
                auVar178 = vrcpps_avx(auVar174);
                fVar93 = auVar178._0_4_;
                fVar132 = auVar178._4_4_;
                fVar133 = auVar178._8_4_;
                fVar99 = auVar178._12_4_;
                fVar131 = auVar178._16_4_;
                fVar134 = auVar178._20_4_;
                fVar231 = auVar178._24_4_;
                auVar97._4_4_ = auVar174._4_4_ * (fVar132 + fVar132);
                auVar97._0_4_ = auVar174._0_4_ * (fVar93 + fVar93);
                auVar97._8_4_ = auVar174._8_4_ * (fVar133 + fVar133);
                auVar97._12_4_ = auVar174._12_4_ * (fVar99 + fVar99);
                auVar97._16_4_ = auVar174._16_4_ * (fVar131 + fVar131);
                auVar97._20_4_ = auVar174._20_4_ * (fVar134 + fVar134);
                auVar97._24_4_ = auVar174._24_4_ * (fVar231 + fVar231);
                auVar97._28_4_ = auVar174._28_4_;
                auVar120._8_4_ = 0x40000000;
                auVar120._0_8_ = 0x4000000040000000;
                auVar120._12_4_ = 0x40000000;
                auVar120._16_4_ = 0x40000000;
                auVar120._20_4_ = 0x40000000;
                auVar120._24_4_ = 0x40000000;
                auVar120._28_4_ = 0x40000000;
                auVar97 = vsubps_avx(auVar120,auVar97);
                auVar221._0_4_ = fVar93 + fVar93 + -1.0;
                auVar221._4_4_ = fVar132 + fVar132 + -1.0;
                auVar221._8_4_ = fVar133 + fVar133 + -1.0;
                auVar221._12_4_ = fVar99 + fVar99 + -1.0;
                auVar221._16_4_ = fVar131 + fVar131 + -1.0;
                auVar221._20_4_ = fVar134 + fVar134 + -1.0;
                auVar221._24_4_ = fVar231 + fVar231 + -1.0;
                auVar221._28_4_ = auVar178._28_4_ + auVar178._28_4_ + -1.0;
                auVar171._0_4_ = auVar221._0_4_ + fVar93 * auVar97._0_4_;
                auVar171._4_4_ = auVar221._4_4_ + fVar132 * auVar97._4_4_;
                auVar171._8_4_ = auVar221._8_4_ + fVar133 * auVar97._8_4_;
                auVar171._12_4_ = auVar221._12_4_ + fVar99 * auVar97._12_4_;
                auVar171._16_4_ = auVar221._16_4_ + fVar131 * auVar97._16_4_;
                auVar171._20_4_ = auVar221._20_4_ + fVar134 * auVar97._20_4_;
                auVar171._24_4_ = auVar221._24_4_ + fVar231 * auVar97._24_4_;
                goto LAB_00265ddf;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar221._4_4_ = fVar132;
                auVar221._0_4_ = fVar132;
                auVar221._8_4_ = fVar132;
                auVar221._12_4_ = fVar132;
                auVar221._16_4_ = fVar132;
                auVar221._20_4_ = fVar132;
                auVar221._24_4_ = fVar132;
                auVar221._28_4_ = fVar132;
                auVar178._0_4_ = auVar353._0_4_ * fVar93 + fVar132;
                auVar178._4_4_ = auVar353._4_4_ * fVar93 + fVar132;
                auVar178._8_4_ = fVar187 * fVar93 + fVar132;
                auVar178._12_4_ = fVar226 * fVar93 + fVar132;
                auVar178._16_4_ = fVar227 * fVar93 + fVar132;
                auVar178._20_4_ = fVar228 * fVar93 + fVar132;
                auVar178._24_4_ = fVar229 * fVar93 + fVar132;
                auVar178._28_4_ = fVar93 + fVar132;
                auVar178 = vmaxps_avx(auVar178,auVar97);
                auVar178 = vminps_avx(auVar178,auVar251);
                auVar171 = auVar178._0_28_;
LAB_00265ddf:
                in_ZMM3 = ZEXT3264(auVar221);
                auVar51._4_4_ = auVar353._4_4_ * auVar171._4_4_;
                auVar51._0_4_ = auVar353._0_4_ * auVar171._0_4_;
                auVar51._8_4_ = fVar187 * auVar171._8_4_;
                auVar51._12_4_ = fVar226 * auVar171._12_4_;
                auVar51._16_4_ = fVar227 * auVar171._16_4_;
                auVar51._20_4_ = fVar228 * auVar171._20_4_;
                auVar51._24_4_ = fVar229 * auVar171._24_4_;
                auVar51._28_4_ = auVar302._28_4_;
                auVar302 = auVar51;
              }
              auVar178 = auVar302;
LAB_00265de7:
              *(undefined1 (*) [32])local_238 = auVar178;
              local_238 = local_238 + 4;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 4) && (_elempack == 8)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar79;
        }
        auVar306 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                      CONCAT424(0x42b0c0a5,
                                                CONCAT420(0x42b0c0a5,
                                                          CONCAT416(0x42b0c0a5,
                                                                    CONCAT412(0x42b0c0a5,
                                                                              CONCAT48(0x42b0c0a5,
                                                                                                                                                                              
                                                  0x42b0c0a542b0c0a5)))))));
        auVar311 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar313 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar332 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar353 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar316 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar324 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar333 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar98 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                     CONCAT424(0x3d2aa9c1,
                                               CONCAT420(0x3d2aa9c1,
                                                         CONCAT416(0x3d2aa9c1,
                                                                   CONCAT412(0x3d2aa9c1,
                                                                             CONCAT48(0x3d2aa9c1,
                                                                                                                                                                            
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar354 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar376 = ZEXT1664(ZEXT816(0) << 0x40);
        for (; uVar79 != uVar78; uVar79 = uVar79 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar79 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar69 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar69 = 0;
          }
          uVar62 = 0;
          uVar67 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar67 = 0;
          }
          uVar74 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar74 = 0;
          }
          for (; uVar62 != uVar74; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar77 = 0; uVar77 != uVar67; uVar77 = uVar77 + 1) {
              if (lVar75 == 0) {
                auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar342 = ZEXT3264(*(undefined1 (*) [32])(lVar75 + uVar79 * 0x20));
              }
              lVar63 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar79 * (this->weight_data_tm).elemsize +
                       0x60;
              for (uVar82 = 0; uVar82 != uVar69; uVar82 = uVar82 + 1) {
                pvVar59 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar82 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar59;
                lVar64 = lVar63;
                for (uVar80 = 0; uVar80 != uVar89; uVar80 = uVar80 + 1) {
                  iVar54 = (((int)uVar80 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    lVar85 = (long)iVar55 * (long)bottom_blob->w * bottom_blob->elemsize;
                    iVar54 = iVar57;
                    for (lVar87 = 0; uVar68 * 0x80 != lVar87; lVar87 = lVar87 + 0x80) {
                      if (((-1 < iVar54) && (iVar55 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar55 < iVar83)) {
                        lVar60 = (long)(iVar55 << 2);
                        fVar93 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85);
                        fVar132 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 4);
                        fVar133 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 8);
                        fVar99 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar85 + 0xc);
                        pfVar65 = (float *)(lVar64 + -0x60 + lVar87);
                        pfVar2 = (float *)(lVar64 + -0x40 + lVar87);
                        pfVar3 = (float *)(lVar64 + -0x20 + lVar87);
                        pfVar84 = (float *)(lVar64 + lVar87);
                        auVar342 = ZEXT3264(CONCAT428(auVar342._28_4_ + fVar93 + fVar132 + fVar133 +
                                                      fVar132 + fVar133,
                                                      CONCAT424(auVar342._24_4_ +
                                                                fVar93 * pfVar65[6] +
                                                                fVar132 * pfVar2[6] +
                                                                fVar133 * pfVar3[6] +
                                                                fVar99 * pfVar84[6],
                                                                CONCAT420(auVar342._20_4_ +
                                                                          fVar93 * pfVar65[5] +
                                                                          fVar132 * pfVar2[5] +
                                                                          fVar133 * pfVar3[5] +
                                                                          fVar99 * pfVar84[5],
                                                                          CONCAT416(auVar342._16_4_
                                                                                    + fVar93 * 
                                                  pfVar65[4] +
                                                  fVar132 * pfVar2[4] + fVar133 * pfVar3[4] +
                                                  fVar99 * pfVar84[4],
                                                  CONCAT412(auVar342._12_4_ + fVar93 * pfVar65[3] +
                                                            fVar132 * pfVar2[3] +
                                                            fVar133 * pfVar3[3] +
                                                            fVar99 * pfVar84[3],
                                                            CONCAT48(auVar342._8_4_ +
                                                                     fVar93 * pfVar65[2] +
                                                                     fVar132 * pfVar2[2] +
                                                                     fVar133 * pfVar3[2] +
                                                                     fVar99 * pfVar84[2],
                                                                     CONCAT44(auVar342._4_4_ +
                                                                              fVar93 * pfVar65[1] +
                                                                              fVar132 * pfVar2[1] +
                                                                              fVar133 * pfVar3[1] +
                                                                              fVar99 * pfVar84[1],
                                                                              auVar342._0_4_ +
                                                                              fVar93 * *pfVar65 +
                                                                              fVar132 * *pfVar2 +
                                                                              fVar133 * *pfVar3 +
                                                                              fVar99 * *pfVar84)))))
                                                  )));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  lVar64 = lVar64 + (long)(int)uVar12 * 0x80;
                }
                lVar63 = lVar63 + (long)(int)(uVar12 * uVar13 * 0x20) * 4;
              }
              auVar251 = auVar342._0_32_;
              if (5 < iVar73 - 1U) goto LAB_00266677;
              auVar221 = auVar376._0_32_;
              auVar254 = vmaxps_avx(auVar251,auVar221);
              fVar343 = auVar342._8_4_;
              fVar344 = auVar342._12_4_;
              fVar345 = auVar342._16_4_;
              fVar346 = auVar342._20_4_;
              fVar347 = auVar342._24_4_;
              fVar244 = auVar313._0_4_;
              fVar264 = auVar313._4_4_;
              fVar265 = auVar313._8_4_;
              fVar266 = auVar313._12_4_;
              fVar267 = auVar313._16_4_;
              fVar268 = auVar313._20_4_;
              fVar269 = auVar313._24_4_;
              auVar178 = auVar353._0_32_;
              fVar314 = auVar316._0_4_;
              fVar317 = auVar316._4_4_;
              fVar318 = auVar316._8_4_;
              fVar319 = auVar316._12_4_;
              fVar320 = auVar316._16_4_;
              fVar321 = auVar316._20_4_;
              fVar322 = auVar316._24_4_;
              fVar323 = auVar324._0_4_;
              fVar325 = auVar324._4_4_;
              fVar326 = auVar324._8_4_;
              fVar327 = auVar324._12_4_;
              fVar328 = auVar324._16_4_;
              fVar329 = auVar324._20_4_;
              fVar330 = auVar324._24_4_;
              fVar331 = auVar333._0_4_;
              fVar334 = auVar333._4_4_;
              fVar335 = auVar333._8_4_;
              fVar336 = auVar333._12_4_;
              fVar337 = auVar333._16_4_;
              fVar338 = auVar333._20_4_;
              fVar339 = auVar333._24_4_;
              fVar348 = auVar354._0_4_;
              fVar355 = auVar354._4_4_;
              fVar356 = auVar354._8_4_;
              fVar357 = auVar354._12_4_;
              fVar358 = auVar354._16_4_;
              fVar359 = auVar354._20_4_;
              fVar360 = auVar354._24_4_;
              auVar302 = auVar306._0_32_;
              auVar97 = auVar311._0_32_;
              fVar134 = auVar332._4_4_;
              fVar231 = auVar332._8_4_;
              fVar228 = auVar332._12_4_;
              fVar232 = auVar332._16_4_;
              fVar377 = auVar332._20_4_;
              fVar382 = auVar332._24_4_;
              fVar21 = auVar332._28_4_;
              fVar93 = auVar98._0_4_;
              fVar131 = auVar98._4_4_;
              fVar233 = auVar98._8_4_;
              fVar227 = auVar98._12_4_;
              fVar230 = auVar98._16_4_;
              fVar378 = auVar98._20_4_;
              fVar381 = auVar98._24_4_;
              fVar99 = auVar353._4_4_;
              fVar187 = auVar353._8_4_;
              fVar226 = auVar353._12_4_;
              fVar229 = auVar353._16_4_;
              fVar379 = auVar353._20_4_;
              fVar380 = auVar353._24_4_;
              fVar22 = auVar353._28_4_;
              fVar132 = auVar353._0_4_;
              fVar133 = auVar332._0_4_;
              switch(iVar73) {
              case 2:
                auVar251 = vminps_avx(auVar251,auVar221);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar376 = ZEXT464(0) << 0x20;
                auVar252._0_4_ = fVar93 * auVar251._0_4_ + auVar254._0_4_;
                auVar252._4_4_ = fVar93 * auVar251._4_4_ + auVar254._4_4_;
                auVar252._8_4_ = fVar93 * auVar251._8_4_ + auVar254._8_4_;
                auVar252._12_4_ = fVar93 * auVar251._12_4_ + auVar254._12_4_;
                auVar252._16_4_ = fVar93 * auVar251._16_4_ + auVar254._16_4_;
                auVar252._20_4_ = fVar93 * auVar251._20_4_ + auVar254._20_4_;
                auVar252._24_4_ = fVar93 * auVar251._24_4_ + auVar254._24_4_;
                auVar252._28_4_ = auVar251._28_4_ + auVar254._28_4_;
                auVar254 = auVar252;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar255._4_4_ = uVar94;
                auVar255._0_4_ = uVar94;
                auVar255._8_4_ = uVar94;
                auVar255._12_4_ = uVar94;
                auVar255._16_4_ = uVar94;
                auVar255._20_4_ = uVar94;
                auVar255._24_4_ = uVar94;
                auVar255._28_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar374._4_4_ = uVar94;
                auVar374._0_4_ = uVar94;
                auVar374._8_4_ = uVar94;
                auVar374._12_4_ = uVar94;
                auVar374._16_4_ = uVar94;
                auVar374._20_4_ = uVar94;
                auVar374._24_4_ = uVar94;
                auVar374._28_4_ = uVar94;
                auVar251 = vmaxps_avx(auVar251,auVar255);
                auVar254 = vminps_avx(auVar374,auVar251);
                auVar376 = ZEXT464(0) << 0x20;
                break;
              case 4:
                auVar256._0_8_ = auVar342._0_8_ ^ 0x8000000080000000;
                auVar256._8_4_ = -fVar343;
                auVar256._12_4_ = -fVar344;
                auVar256._16_4_ = -fVar345;
                auVar256._20_4_ = -fVar346;
                auVar256._24_4_ = -fVar347;
                auVar256._28_4_ = -auVar342._28_4_;
                auVar251 = vminps_avx(auVar256,auVar302);
                auVar302 = vmaxps_avx(auVar97,auVar251);
                auVar340._0_4_ = fVar244 * auVar302._0_4_ + fVar133;
                auVar340._4_4_ = fVar264 * auVar302._4_4_ + fVar134;
                auVar340._8_4_ = fVar265 * auVar302._8_4_ + fVar231;
                auVar340._12_4_ = fVar266 * auVar302._12_4_ + fVar228;
                auVar340._16_4_ = fVar267 * auVar302._16_4_ + fVar232;
                auVar340._20_4_ = fVar268 * auVar302._20_4_ + fVar377;
                auVar340._24_4_ = fVar269 * auVar302._24_4_ + fVar382;
                auVar340._28_4_ = auVar342._28_4_ + fVar21;
                auVar97 = vroundps_avx(auVar340,1);
                auVar251 = vcmpps_avx(auVar340,auVar97,1);
                auVar251 = vandps_avx(auVar251,auVar178);
                auVar251 = vsubps_avx(auVar97,auVar251);
                fVar244 = auVar251._0_4_ * -0.6931472 + auVar302._0_4_;
                fVar264 = auVar251._4_4_ * -0.6931472 + auVar302._4_4_;
                fVar265 = auVar251._8_4_ * -0.6931472 + auVar302._8_4_;
                fVar266 = auVar251._12_4_ * -0.6931472 + auVar302._12_4_;
                fVar267 = auVar251._16_4_ * -0.6931472 + auVar302._16_4_;
                fVar268 = auVar251._20_4_ * -0.6931472 + auVar302._20_4_;
                fVar269 = auVar251._24_4_ * -0.6931472 + auVar302._24_4_;
                auVar376 = ZEXT464(0) << 0x20;
                auVar247._0_4_ = (int)auVar251._0_4_;
                auVar247._4_4_ = (int)auVar251._4_4_;
                auVar247._8_4_ = (int)auVar251._8_4_;
                auVar247._12_4_ = (int)auVar251._12_4_;
                auVar257._16_4_ = (int)auVar251._16_4_;
                auVar257._0_16_ = auVar247;
                auVar257._20_4_ = (int)auVar251._20_4_;
                auVar257._24_4_ = (int)auVar251._24_4_;
                auVar257._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar247,0x17);
                auVar188 = vpslld_avx(auVar257._16_16_,0x17);
                auVar137._8_4_ = 0x3f800000;
                auVar137._0_8_ = 0x3f8000003f800000;
                auVar137._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar137);
                auVar270 = vpaddd_avx(auVar270,auVar137);
                auVar124._0_4_ =
                     (fVar244 + fVar132 +
                     fVar244 * fVar244 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar244) * fVar244) * fVar244 + fVar93) *
                      fVar244) * fVar244 + fVar133)) * auVar270._0_4_ + fVar132;
                auVar124._4_4_ =
                     (fVar264 + fVar99 +
                     fVar264 * fVar264 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar264) * fVar264) * fVar264 + fVar131) *
                      fVar264) * fVar264 + fVar134)) * auVar270._4_4_ + fVar99;
                auVar124._8_4_ =
                     (fVar265 + fVar187 +
                     fVar265 * fVar265 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar265) * fVar265) * fVar265 + fVar233) *
                      fVar265) * fVar265 + fVar231)) * auVar270._8_4_ + fVar187;
                auVar124._12_4_ =
                     (fVar266 + fVar226 +
                     fVar266 * fVar266 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar266) * fVar266) * fVar266 + fVar227) *
                      fVar266) * fVar266 + fVar228)) * auVar270._12_4_ + fVar226;
                auVar124._16_4_ =
                     (fVar267 + fVar229 +
                     fVar267 * fVar267 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar267) * fVar267) * fVar267 + fVar230) *
                      fVar267) * fVar267 + fVar232)) * auVar188._0_4_ + fVar229;
                auVar124._20_4_ =
                     (fVar268 + fVar379 +
                     fVar268 * fVar268 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar268) * fVar268) * fVar268 + fVar378) *
                      fVar268) * fVar268 + fVar377)) * auVar188._4_4_ + fVar379;
                auVar124._24_4_ =
                     (fVar269 + fVar380 +
                     fVar269 * fVar269 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar269) * fVar269) * fVar269 + fVar381) *
                      fVar269) * fVar269 + fVar382)) * auVar188._8_4_ + fVar380;
                auVar124._28_4_ =
                     auVar97._28_4_ + auVar302._28_4_ + fVar22 +
                     auVar354._28_4_ +
                     auVar333._28_4_ + auVar324._28_4_ + -0.6931472 + auVar98._28_4_ + fVar21 +
                     fVar22;
                auVar251 = vrcpps_avx(auVar124);
                fVar93 = auVar251._0_4_;
                fVar132 = auVar251._4_4_;
                auVar38._4_4_ = auVar124._4_4_ * fVar132;
                auVar38._0_4_ = auVar124._0_4_ * fVar93;
                fVar133 = auVar251._8_4_;
                auVar38._8_4_ = auVar124._8_4_ * fVar133;
                fVar99 = auVar251._12_4_;
                auVar38._12_4_ = auVar124._12_4_ * fVar99;
                fVar131 = auVar251._16_4_;
                auVar38._16_4_ = auVar124._16_4_ * fVar131;
                fVar134 = auVar251._20_4_;
                auVar38._20_4_ = auVar124._20_4_ * fVar134;
                fVar231 = auVar251._24_4_;
                auVar38._24_4_ = auVar124._24_4_ * fVar231;
                auVar38._28_4_ = auVar124._28_4_;
                auVar178 = vsubps_avx(auVar178,auVar38);
                auVar254._0_4_ = fVar93 + fVar93 * auVar178._0_4_;
                auVar254._4_4_ = fVar132 + fVar132 * auVar178._4_4_;
                auVar254._8_4_ = fVar133 + fVar133 * auVar178._8_4_;
                auVar254._12_4_ = fVar99 + fVar99 * auVar178._12_4_;
                auVar254._16_4_ = fVar131 + fVar131 * auVar178._16_4_;
                auVar254._20_4_ = fVar134 + fVar134 * auVar178._20_4_;
                auVar254._24_4_ = fVar231 + fVar231 * auVar178._24_4_;
                auVar254._28_4_ = auVar251._28_4_ + auVar178._28_4_;
                break;
              case 5:
                auVar251 = vminps_avx(auVar251,auVar302);
                auVar221 = vmaxps_avx(auVar97,auVar251);
                auVar253._0_4_ = fVar244 * auVar221._0_4_ + fVar133;
                auVar253._4_4_ = fVar264 * auVar221._4_4_ + fVar134;
                auVar253._8_4_ = fVar265 * auVar221._8_4_ + fVar231;
                auVar253._12_4_ = fVar266 * auVar221._12_4_ + fVar228;
                auVar253._16_4_ = fVar267 * auVar221._16_4_ + fVar232;
                auVar253._20_4_ = fVar268 * auVar221._20_4_ + fVar377;
                auVar253._24_4_ = fVar269 * auVar221._24_4_ + fVar382;
                auVar253._28_4_ = auVar254._28_4_ + fVar21;
                auVar30 = vroundps_avx(auVar253,1);
                auVar251 = vcmpps_avx(auVar253,auVar30,1);
                auVar251 = vandps_avx(auVar251,auVar178);
                auVar251 = vsubps_avx(auVar30,auVar251);
                auVar34._4_4_ = auVar251._4_4_ * 0.6931472;
                auVar34._0_4_ = auVar251._0_4_ * 0.6931472;
                auVar34._8_4_ = auVar251._8_4_ * 0.6931472;
                auVar34._12_4_ = auVar251._12_4_ * 0.6931472;
                auVar34._16_4_ = auVar251._16_4_ * 0.6931472;
                auVar34._20_4_ = auVar251._20_4_ * 0.6931472;
                auVar34._24_4_ = auVar251._24_4_ * 0.6931472;
                auVar34._28_4_ = auVar30._28_4_;
                auVar178 = vsubps_avx(auVar221,auVar34);
                fVar23 = auVar178._0_4_;
                fVar24 = auVar178._4_4_;
                fVar25 = auVar178._8_4_;
                fVar26 = auVar178._12_4_;
                fVar27 = auVar178._16_4_;
                fVar28 = auVar178._20_4_;
                fVar29 = auVar178._24_4_;
                auVar135._0_4_ = (int)auVar251._0_4_;
                auVar135._4_4_ = (int)auVar251._4_4_;
                auVar135._8_4_ = (int)auVar251._8_4_;
                auVar135._12_4_ = (int)auVar251._12_4_;
                auVar179._16_4_ = (int)auVar251._16_4_;
                auVar179._0_16_ = auVar135;
                auVar179._20_4_ = (int)auVar251._20_4_;
                auVar179._24_4_ = (int)auVar251._24_4_;
                auVar179._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar135,0x17);
                auVar188 = vpslld_avx(auVar179._16_16_,0x17);
                auVar189._8_4_ = 0x3f800000;
                auVar189._0_8_ = 0x3f8000003f800000;
                auVar189._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar189);
                auVar270 = vpaddd_avx(auVar270,auVar189);
                local_168._0_4_ =
                     (fVar23 + fVar132 +
                     fVar23 * fVar23 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar23) * fVar23) * fVar23 + fVar93) * fVar23
                      ) * fVar23 + fVar133)) * auVar270._0_4_ + fVar132;
                local_168._4_4_ =
                     (fVar24 + fVar99 +
                     fVar24 * fVar24 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar24) * fVar24) * fVar24 + fVar131) *
                      fVar24) * fVar24 + fVar134)) * auVar270._4_4_ + fVar99;
                local_168._8_4_ =
                     (fVar25 + fVar187 +
                     fVar25 * fVar25 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar25) * fVar25) * fVar25 + fVar233) *
                      fVar25) * fVar25 + fVar231)) * auVar270._8_4_ + fVar187;
                local_168._12_4_ =
                     (fVar26 + fVar226 +
                     fVar26 * fVar26 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar26) * fVar26) * fVar26 + fVar227) *
                      fVar26) * fVar26 + fVar228)) * auVar270._12_4_ + fVar226;
                local_168._16_4_ =
                     (fVar27 + fVar229 +
                     fVar27 * fVar27 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar27) * fVar27) * fVar27 + fVar230) *
                      fVar27) * fVar27 + fVar232)) * auVar188._0_4_ + fVar229;
                local_168._20_4_ =
                     (fVar28 + fVar379 +
                     fVar28 * fVar28 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar28) * fVar28) * fVar28 + fVar378) *
                      fVar28) * fVar28 + fVar377)) * auVar188._4_4_ + fVar379;
                local_168._24_4_ =
                     (fVar29 + fVar380 +
                     fVar29 * fVar29 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar29) * fVar29) * fVar29 + fVar381) *
                      fVar29) * fVar29 + fVar382)) * auVar188._8_4_ + fVar380;
                local_168._28_4_ =
                     auVar178._28_4_ + fVar22 +
                     auVar354._28_4_ +
                     auVar333._28_4_ + auVar324._28_4_ + 0.6931472 + auVar98._28_4_ + fVar21 +
                     fVar22;
                auVar121._8_4_ = 0x800000;
                auVar121._0_8_ = 0x80000000800000;
                auVar121._12_4_ = 0x800000;
                auVar121._16_4_ = 0x800000;
                auVar121._20_4_ = 0x800000;
                auVar121._24_4_ = 0x800000;
                auVar121._28_4_ = 0x800000;
                auVar221 = vmaxps_avx(local_168,auVar121);
                auVar188 = vpsrld_avx(auVar221._16_16_,0x17);
                auVar222._8_4_ = 0x807fffff;
                auVar222._0_8_ = 0x807fffff807fffff;
                auVar222._12_4_ = 0x807fffff;
                auVar222._16_4_ = 0x807fffff;
                auVar222._20_4_ = 0x807fffff;
                auVar222._24_4_ = 0x807fffff;
                auVar222._28_4_ = 0x807fffff;
                auVar251 = vandps_avx(auVar221,auVar222);
                auVar30 = vorps_avx(auVar251,auVar332._0_32_);
                auVar223._8_4_ = 0x3f3504f3;
                auVar223._0_8_ = 0x3f3504f33f3504f3;
                auVar223._12_4_ = 0x3f3504f3;
                auVar223._16_4_ = 0x3f3504f3;
                auVar223._20_4_ = 0x3f3504f3;
                auVar223._24_4_ = 0x3f3504f3;
                auVar223._28_4_ = 0x3f3504f3;
                auVar178 = vcmpps_avx(auVar223,auVar30,2);
                auVar251 = vandnps_avx(auVar178,auVar30);
                fVar132 = auVar30._0_4_ + -1.0 + auVar251._0_4_;
                fVar99 = auVar30._4_4_ + -1.0 + auVar251._4_4_;
                fVar187 = auVar30._8_4_ + -1.0 + auVar251._8_4_;
                fVar226 = auVar30._12_4_ + -1.0 + auVar251._12_4_;
                fVar229 = auVar30._16_4_ + -1.0 + auVar251._16_4_;
                fVar379 = auVar30._20_4_ + -1.0 + auVar251._20_4_;
                fVar380 = auVar30._24_4_ + -1.0 + auVar251._24_4_;
                auVar188 = vpsubd_avx(auVar188,auVar178._16_16_);
                auVar306 = ZEXT3264(auVar302);
                auVar311 = ZEXT3264(auVar97);
                auVar313 = ZEXT3264(auVar313._0_32_);
                auVar316 = ZEXT3264(auVar316._0_32_);
                auVar324 = ZEXT3264(auVar324._0_32_);
                auVar333 = ZEXT3264(auVar333._0_32_);
                auVar98 = ZEXT3264(auVar98._0_32_);
                auVar332 = ZEXT3264(auVar332._0_32_);
                auVar354 = ZEXT3264(auVar354._0_32_);
                auVar242._8_4_ = 0x3f800000;
                auVar242._0_8_ = 0x3f8000003f800000;
                auVar242._12_4_ = 0x3f800000;
                auVar242._16_4_ = 0x3f800000;
                auVar242._20_4_ = 0x3f800000;
                auVar242._24_4_ = 0x3f800000;
                auVar242._28_4_ = 0x3f800000;
                auVar353 = ZEXT3264(auVar242);
                auVar270 = vpsrld_avx(auVar221._0_16_,0x17);
                auVar245._8_4_ = 0xffffff81;
                auVar245._0_8_ = 0xffffff81ffffff81;
                auVar245._12_4_ = 0xffffff81;
                auVar188 = vpaddd_avx(auVar188,auVar245);
                auVar270 = vpsubd_avx(auVar270,auVar178._0_16_);
                auVar270 = vpaddd_avx(auVar270,auVar245);
                auVar122._16_16_ = auVar188;
                auVar122._0_16_ = auVar270;
                auVar178 = vcmpps_avx(local_168,_DAT_004f2e40,2);
                auVar221 = vcvtdq2ps_avx(auVar122);
                auVar376 = ZEXT464(0) << 0x20;
                auVar35._4_4_ =
                     (fVar99 + auVar221._4_4_ * 0.6931472 +
                     fVar99 * fVar99 *
                     (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 *
                                                                                            (fVar99 
                                                  * 0.070376836 + -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                     -2.0;
                auVar35._0_4_ =
                     (fVar132 + auVar221._0_4_ * 0.6931472 +
                     fVar132 * fVar132 *
                     (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (
                                                  fVar132 * (fVar132 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._8_4_ =
                     (fVar187 + auVar221._8_4_ * 0.6931472 +
                     fVar187 * fVar187 *
                     (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (
                                                  fVar187 * (fVar187 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._12_4_ =
                     (fVar226 + auVar221._12_4_ * 0.6931472 +
                     fVar226 * fVar226 *
                     (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (fVar226 * (
                                                  fVar226 * (fVar226 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._16_4_ =
                     (fVar229 + auVar221._16_4_ * 0.6931472 +
                     fVar229 * fVar229 *
                     (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (
                                                  fVar229 * (fVar229 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._20_4_ =
                     (fVar379 + auVar221._20_4_ * 0.6931472 +
                     fVar379 * fVar379 *
                     (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (
                                                  fVar379 * (fVar379 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._24_4_ =
                     (fVar380 + auVar221._24_4_ * 0.6931472 +
                     fVar380 * fVar380 *
                     (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (fVar380 * (
                                                  fVar380 * (fVar380 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar35._28_4_ = auVar30._28_4_ + -1.0 + auVar251._28_4_ + auVar221._28_4_ + 0.0;
                auVar180._8_4_ = 0x7fffffff;
                auVar180._0_8_ = 0x7fffffff7fffffff;
                auVar180._12_4_ = 0x7fffffff;
                auVar180._16_4_ = 0x7fffffff;
                auVar180._20_4_ = 0x7fffffff;
                auVar180._24_4_ = 0x7fffffff;
                auVar180._28_4_ = 0x7fffffff;
                auVar251 = vblendvps_avx(auVar35,auVar180,auVar178);
                auVar251 = vminps_avx(auVar251,auVar302);
                auVar178 = vmaxps_avx(auVar97,auVar251);
                auVar181._0_4_ = fVar244 * auVar178._0_4_ + fVar133;
                auVar181._4_4_ = fVar264 * auVar178._4_4_ + fVar134;
                auVar181._8_4_ = fVar265 * auVar178._8_4_ + fVar231;
                auVar181._12_4_ = fVar266 * auVar178._12_4_ + fVar228;
                auVar181._16_4_ = fVar267 * auVar178._16_4_ + fVar232;
                auVar181._20_4_ = fVar268 * auVar178._20_4_ + fVar377;
                auVar181._24_4_ = fVar269 * auVar178._24_4_ + fVar382;
                auVar181._28_4_ = fVar21 + NAN;
                auVar302 = vroundps_avx(auVar181,1);
                auVar251 = vcmpps_avx(auVar181,auVar302,1);
                auVar251 = vandps_avx(auVar251,auVar242);
                auVar251 = vsubps_avx(auVar302,auVar251);
                auVar36._4_4_ = auVar251._4_4_ * 0.6931472;
                auVar36._0_4_ = auVar251._0_4_ * 0.6931472;
                auVar36._8_4_ = auVar251._8_4_ * 0.6931472;
                auVar36._12_4_ = auVar251._12_4_ * 0.6931472;
                auVar36._16_4_ = auVar251._16_4_ * 0.6931472;
                auVar36._20_4_ = auVar251._20_4_ * 0.6931472;
                auVar36._24_4_ = auVar251._24_4_ * 0.6931472;
                auVar36._28_4_ = auVar302._28_4_;
                auVar178 = vsubps_avx(auVar178,auVar36);
                fVar132 = auVar178._0_4_;
                fVar99 = auVar178._4_4_;
                fVar187 = auVar178._8_4_;
                fVar226 = auVar178._12_4_;
                fVar229 = auVar178._16_4_;
                fVar379 = auVar178._20_4_;
                fVar380 = auVar178._24_4_;
                auVar136._0_4_ = (int)auVar251._0_4_;
                auVar136._4_4_ = (int)auVar251._4_4_;
                auVar136._8_4_ = (int)auVar251._8_4_;
                auVar136._12_4_ = (int)auVar251._12_4_;
                auVar182._16_4_ = (int)auVar251._16_4_;
                auVar182._0_16_ = auVar136;
                auVar182._20_4_ = (int)auVar251._20_4_;
                auVar182._24_4_ = (int)auVar251._24_4_;
                auVar182._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar136,0x17);
                auVar188 = vpslld_avx(auVar182._16_16_,0x17);
                auVar246._8_4_ = 0x3f800000;
                auVar246._0_8_ = 0x3f8000003f800000;
                auVar246._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar246);
                auVar270 = vpaddd_avx(auVar270,auVar246);
                auVar123._0_4_ =
                     (fVar132 + 1.0 +
                     fVar132 * fVar132 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar132) * fVar132) * fVar132 + fVar93) *
                      fVar132) * fVar132 + fVar133)) * auVar270._0_4_ + 1.0;
                auVar123._4_4_ =
                     (fVar99 + 1.0 +
                     fVar99 * fVar99 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar99) * fVar99) * fVar99 + fVar131) *
                      fVar99) * fVar99 + fVar134)) * auVar270._4_4_ + 1.0;
                auVar123._8_4_ =
                     (fVar187 + 1.0 +
                     fVar187 * fVar187 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar187) * fVar187) * fVar187 + fVar233) *
                      fVar187) * fVar187 + fVar231)) * auVar270._8_4_ + 1.0;
                auVar123._12_4_ =
                     (fVar226 + 1.0 +
                     fVar226 * fVar226 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar226) * fVar226) * fVar226 + fVar227) *
                      fVar226) * fVar226 + fVar228)) * auVar270._12_4_ + 1.0;
                auVar123._16_4_ =
                     (fVar229 + 1.0 +
                     fVar229 * fVar229 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar229) * fVar229) * fVar229 + fVar230) *
                      fVar229) * fVar229 + fVar232)) * auVar188._0_4_ + 1.0;
                auVar123._20_4_ =
                     (fVar379 + 1.0 +
                     fVar379 * fVar379 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar379) * fVar379) * fVar379 + fVar378) *
                      fVar379) * fVar379 + fVar377)) * auVar188._4_4_ + 1.0;
                auVar123._24_4_ =
                     (fVar380 + 1.0 +
                     fVar380 * fVar380 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar380) * fVar380) * fVar380 + fVar381) *
                      fVar380) * fVar380 + fVar382)) * auVar188._8_4_ + 1.0;
                auVar123._28_4_ = auVar178._28_4_ + 1.0 + auVar302._28_4_ + 1.0;
                auVar251 = vrcpps_avx(auVar123);
                fVar93 = auVar251._0_4_;
                fVar132 = auVar251._4_4_;
                fVar133 = auVar251._8_4_;
                fVar99 = auVar251._12_4_;
                fVar131 = auVar251._16_4_;
                fVar134 = auVar251._20_4_;
                fVar231 = auVar251._24_4_;
                auVar37._4_4_ = auVar123._4_4_ * (fVar132 + fVar132);
                auVar37._0_4_ = auVar123._0_4_ * (fVar93 + fVar93);
                auVar37._8_4_ = auVar123._8_4_ * (fVar133 + fVar133);
                auVar37._12_4_ = auVar123._12_4_ * (fVar99 + fVar99);
                auVar37._16_4_ = auVar123._16_4_ * (fVar131 + fVar131);
                auVar37._20_4_ = auVar123._20_4_ * (fVar134 + fVar134);
                auVar37._24_4_ = auVar123._24_4_ * (fVar231 + fVar231);
                auVar37._28_4_ = auVar123._28_4_;
                auVar254._8_4_ = 2.0;
                auVar254._0_8_ = 0x4000000040000000;
                auVar254._12_4_ = 2.0;
                auVar254._16_4_ = 2.0;
                auVar254._20_4_ = 2.0;
                auVar254._24_4_ = 2.0;
                auVar254._28_4_ = 2.0;
                auVar251 = vsubps_avx(auVar254,auVar37);
                auVar118._0_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar251._0_4_;
                auVar118._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar251._4_4_;
                auVar118._8_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar251._8_4_;
                auVar118._12_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar251._12_4_;
                auVar118._16_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar251._16_4_;
                auVar118._20_4_ = fVar134 + fVar134 + -1.0 + fVar134 * auVar251._20_4_;
                auVar118._24_4_ = fVar231 + fVar231 + -1.0 + fVar231 * auVar251._24_4_;
                goto LAB_0026666f;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar125._0_4_ = auVar342._0_4_ * fVar93 + fVar132;
                auVar125._4_4_ = auVar342._4_4_ * fVar93 + fVar132;
                auVar125._8_4_ = fVar343 * fVar93 + fVar132;
                auVar125._12_4_ = fVar344 * fVar93 + fVar132;
                auVar125._16_4_ = fVar345 * fVar93 + fVar132;
                auVar125._20_4_ = fVar346 * fVar93 + fVar132;
                auVar125._24_4_ = fVar347 * fVar93 + fVar132;
                auVar125._28_4_ = fVar93 + fVar132;
                auVar251 = vmaxps_avx(auVar221,auVar125);
                auVar251 = vminps_avx(auVar251,auVar178);
                auVar118 = auVar251._0_28_;
LAB_0026666f:
                auVar52._4_4_ = auVar342._4_4_ * auVar118._4_4_;
                auVar52._0_4_ = auVar342._0_4_ * auVar118._0_4_;
                auVar52._8_4_ = fVar343 * auVar118._8_4_;
                auVar52._12_4_ = fVar344 * auVar118._12_4_;
                auVar52._16_4_ = fVar345 * auVar118._16_4_;
                auVar52._20_4_ = fVar346 * auVar118._20_4_;
                auVar52._24_4_ = fVar347 * auVar118._24_4_;
                auVar52._28_4_ = auVar254._28_4_;
                auVar254 = auVar52;
              }
              auVar251 = auVar254;
LAB_00266677:
              *(undefined1 (*) [32])local_238 = auVar251;
              local_238 = local_238 + 4;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 8) && (_elempack == 4)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar79;
        }
        auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar353 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar332 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar79 != uVar78; uVar79 = uVar79 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar79 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar69 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar69 = 0;
          }
          uVar62 = 0;
          uVar67 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar67 = 0;
          }
          uVar74 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar74 = 0;
          }
          for (; uVar62 != uVar74; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar77 = 0; uVar77 != uVar67; uVar77 = uVar77 + 1) {
              if (lVar75 == 0) {
                auVar188 = ZEXT816(0) << 0x40;
              }
              else {
                auVar188 = *(undefined1 (*) [16])(lVar75 + uVar79 * 0x10);
              }
              auVar306 = ZEXT1664(auVar188);
              lVar63 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar79 * (this->weight_data_tm).elemsize +
                       0x70;
              for (uVar82 = 0; uVar82 != uVar69; uVar82 = uVar82 + 1) {
                pvVar59 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar82 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar59;
                lVar64 = lVar63;
                for (uVar80 = 0; uVar80 != uVar89; uVar80 = uVar80 + 1) {
                  iVar54 = (((int)uVar80 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    lVar87 = (long)iVar55 * (long)bottom_blob->w * bottom_blob->elemsize;
                    iVar54 = iVar57;
                    for (lVar85 = 0; uVar68 * 0x80 != lVar85; lVar85 = lVar85 + 0x80) {
                      if (((-1 < iVar54) && (iVar55 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar55 < iVar83)) {
                        lVar60 = (long)(iVar55 << 3);
                        fVar93 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87);
                        fVar132 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 4);
                        fVar133 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 8);
                        fVar99 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0xc);
                        fVar131 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0x10);
                        fVar134 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0x14);
                        fVar231 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0x18);
                        fVar233 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0x1c);
                        pfVar65 = (float *)(lVar64 + -0x70 + lVar85);
                        pfVar2 = (float *)(lVar64 + -0x60 + lVar85);
                        pfVar3 = (float *)(lVar64 + -0x50 + lVar85);
                        pfVar4 = (float *)(lVar64 + -0x40 + lVar85);
                        pfVar5 = (float *)(lVar64 + -0x30 + lVar85);
                        pfVar6 = (float *)(lVar64 + -0x20 + lVar85);
                        pfVar7 = (float *)(lVar64 + -0x10 + lVar85);
                        pfVar84 = (float *)(lVar64 + lVar85);
                        auVar306 = ZEXT1664(CONCAT412(fVar93 * pfVar65[3] + auVar306._12_4_ +
                                                      fVar132 * pfVar2[3] + fVar133 * pfVar3[3] +
                                                      fVar99 * pfVar4[3] + fVar131 * pfVar5[3] +
                                                      fVar134 * pfVar6[3] +
                                                      fVar231 * pfVar7[3] + fVar233 * pfVar84[3],
                                                      CONCAT48(fVar93 * pfVar65[2] + auVar306._8_4_
                                                               + fVar132 * pfVar2[2] +
                                                                 fVar133 * pfVar3[2] +
                                                               fVar99 * pfVar4[2] +
                                                               fVar131 * pfVar5[2] +
                                                               fVar134 * pfVar6[2] +
                                                               fVar231 * pfVar7[2] +
                                                               fVar233 * pfVar84[2],
                                                               CONCAT44(fVar93 * pfVar65[1] +
                                                                        auVar306._4_4_ +
                                                                        fVar132 * pfVar2[1] +
                                                                        fVar133 * pfVar3[1] +
                                                                        fVar99 * pfVar4[1] +
                                                                        fVar131 * pfVar5[1] +
                                                                        fVar134 * pfVar6[1] +
                                                                        fVar231 * pfVar7[1] +
                                                                        fVar233 * pfVar84[1],
                                                                        fVar93 * *pfVar65 +
                                                                        auVar306._0_4_ +
                                                                        fVar132 * *pfVar2 +
                                                                        fVar133 * *pfVar3 +
                                                                        fVar99 * *pfVar4 +
                                                                        fVar131 * *pfVar5 +
                                                                        fVar134 * *pfVar6 +
                                                                        fVar231 * *pfVar7 +
                                                                        fVar233 * *pfVar84))));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  lVar64 = lVar64 + (long)(int)uVar12 * 0x80;
                }
                lVar63 = lVar63 + (long)(int)(uVar12 * uVar13 * 0x20) * 4;
              }
              auVar188 = auVar306._0_16_;
              if (5 < iVar73 - 1U) goto LAB_00266ee7;
              auVar270 = auVar98._0_16_;
              auVar280 = vmaxps_avx(auVar188,auVar270);
              auVar100 = auVar332._0_16_;
              fVar132 = auVar353._4_4_;
              fVar131 = auVar353._8_4_;
              fVar231 = auVar353._12_4_;
              fVar226 = auVar353._0_4_;
              fVar93 = auVar332._0_4_;
              fVar133 = auVar332._4_4_;
              fVar99 = auVar332._8_4_;
              fVar134 = auVar332._12_4_;
              fVar233 = auVar306._8_4_;
              fVar187 = auVar306._12_4_;
              switch(iVar73) {
              case 2:
                auVar188 = vminps_avx(auVar188,auVar270);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar272._0_4_ = fVar93 * auVar188._0_4_ + auVar280._0_4_;
                auVar272._4_4_ = fVar93 * auVar188._4_4_ + auVar280._4_4_;
                auVar272._8_4_ = fVar93 * auVar188._8_4_ + auVar280._8_4_;
                auVar272._12_4_ = fVar93 * auVar188._12_4_ + auVar280._12_4_;
                auVar280 = auVar272;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar277._4_4_ = uVar94;
                auVar277._0_4_ = uVar94;
                auVar277._8_4_ = uVar94;
                auVar277._12_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar363._4_4_ = uVar94;
                auVar363._0_4_ = uVar94;
                auVar363._8_4_ = uVar94;
                auVar363._12_4_ = uVar94;
                auVar188 = vmaxps_avx(auVar188,auVar277);
                auVar280 = vminps_avx(auVar363,auVar188);
                break;
              case 4:
                auVar102._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                auVar102._8_4_ = -fVar233;
                auVar102._12_4_ = -fVar187;
                auVar143._8_4_ = 0x42b0c0a5;
                auVar143._0_8_ = 0x42b0c0a542b0c0a5;
                auVar143._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar102,auVar143);
                auVar144._8_4_ = 0xc2b0c0a5;
                auVar144._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar144._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar144);
                auVar278._0_4_ = fVar226 + auVar307._0_4_ * 1.442695;
                auVar278._4_4_ = fVar132 + auVar307._4_4_ * 1.442695;
                auVar278._8_4_ = fVar131 + auVar307._8_4_ * 1.442695;
                auVar278._12_4_ = fVar231 + auVar307._12_4_ * 1.442695;
                auVar364._0_4_ = (int)auVar278._0_4_;
                auVar364._4_4_ = (int)auVar278._4_4_;
                auVar364._8_4_ = (int)auVar278._8_4_;
                auVar364._12_4_ = (int)auVar278._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar364);
                auVar188 = vcmpps_avx(auVar278,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                fVar233 = auVar188._0_4_ * -0.6931472 + auVar307._0_4_;
                fVar187 = auVar188._4_4_ * -0.6931472 + auVar307._4_4_;
                fVar227 = auVar188._8_4_ * -0.6931472 + auVar307._8_4_;
                fVar228 = auVar188._12_4_ * -0.6931472 + auVar307._12_4_;
                auVar279._0_4_ = (int)auVar188._0_4_;
                auVar279._4_4_ = (int)auVar188._4_4_;
                auVar279._8_4_ = (int)auVar188._8_4_;
                auVar279._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar279,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar103._0_4_ =
                     (fVar233 * fVar233 *
                      (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) *
                         fVar233 + 0.041665796) * fVar233 + 0.16666666) * fVar233 + fVar226) +
                     fVar233 + fVar93) * auVar188._0_4_ + fVar93;
                auVar103._4_4_ =
                     (fVar187 * fVar187 *
                      (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                         fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar132) +
                     fVar187 + fVar133) * auVar188._4_4_ + fVar133;
                auVar103._8_4_ =
                     (fVar227 * fVar227 *
                      (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) *
                         fVar227 + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar131) +
                     fVar227 + fVar99) * auVar188._8_4_ + fVar99;
                auVar103._12_4_ =
                     (fVar228 * fVar228 *
                      (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) *
                         fVar228 + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar231) +
                     fVar228 + fVar134) * auVar188._12_4_ + fVar134;
                auVar188 = vrcpps_avx(auVar103);
                fVar93 = auVar188._0_4_;
                auVar104._0_4_ = auVar103._0_4_ * fVar93;
                fVar132 = auVar188._4_4_;
                auVar104._4_4_ = auVar103._4_4_ * fVar132;
                fVar133 = auVar188._8_4_;
                auVar104._8_4_ = auVar103._8_4_ * fVar133;
                fVar99 = auVar188._12_4_;
                auVar104._12_4_ = auVar103._12_4_ * fVar99;
                auVar188 = vsubps_avx(auVar100,auVar104);
                auVar280._0_4_ = fVar93 + fVar93 * auVar188._0_4_;
                auVar280._4_4_ = fVar132 + fVar132 * auVar188._4_4_;
                auVar280._8_4_ = fVar133 + fVar133 * auVar188._8_4_;
                auVar280._12_4_ = fVar99 + fVar99 * auVar188._12_4_;
                break;
              case 5:
                auVar234._8_4_ = 0x42b0c0a5;
                auVar234._0_8_ = 0x42b0c0a542b0c0a5;
                auVar234._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar234);
                auVar308._8_4_ = 0xc2b0c0a5;
                auVar308._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar308._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar308,auVar188);
                auVar349._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar349._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar349._8_4_ = auVar307._8_4_ * 1.442695 + fVar131;
                auVar349._12_4_ = auVar307._12_4_ * 1.442695 + fVar231;
                auVar361._0_4_ = (int)auVar349._0_4_;
                auVar361._4_4_ = (int)auVar349._4_4_;
                auVar361._8_4_ = (int)auVar349._8_4_;
                auVar361._12_4_ = (int)auVar349._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar361);
                auVar188 = vcmpps_avx(auVar349,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar362._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar362._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar362._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar362._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar270 = vsubps_avx(auVar307,auVar362);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar273._0_4_ = (int)auVar188._0_4_;
                auVar273._4_4_ = (int)auVar188._4_4_;
                auVar273._8_4_ = (int)auVar188._8_4_;
                auVar273._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar273,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar274._0_4_ =
                     (fVar227 + fVar93 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226)) * auVar188._0_4_
                     + fVar93;
                auVar274._4_4_ =
                     (fVar228 + fVar133 +
                     fVar228 * fVar228 *
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132)) * auVar188._4_4_
                     + fVar133;
                auVar274._8_4_ =
                     (fVar229 + fVar99 +
                     fVar229 * fVar229 *
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar131)) * auVar188._8_4_
                     + fVar99;
                auVar274._12_4_ =
                     (fVar230 + fVar134 +
                     fVar230 * fVar230 *
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar231)) *
                     auVar188._12_4_ + fVar134;
                auVar138._8_4_ = 0x800000;
                auVar138._0_8_ = 0x80000000800000;
                auVar138._12_4_ = 0x800000;
                auVar188 = vmaxps_avx(auVar274,auVar138);
                auVar270 = vpsrld_avx(auVar188,0x17);
                auVar190._8_4_ = 0xffffff82;
                auVar190._0_8_ = 0xffffff82ffffff82;
                auVar190._12_4_ = 0xffffff82;
                auVar270 = vpaddd_avx(auVar270,auVar190);
                auVar191._8_4_ = 0x807fffff;
                auVar191._0_8_ = 0x807fffff807fffff;
                auVar191._12_4_ = 0x807fffff;
                auVar188 = vandps_avx(auVar188,auVar191);
                auVar101 = vorps_avx(auVar188,auVar353._0_16_);
                auVar307 = vcvtdq2ps_avx(auVar270);
                auVar192._8_4_ = 0x3f3504f3;
                auVar192._0_8_ = 0x3f3504f33f3504f3;
                auVar192._12_4_ = 0x3f3504f3;
                auVar270 = vcmpps_avx(auVar101,auVar192,1);
                auVar188 = vandps_avx(auVar270,auVar101);
                fVar227 = auVar101._0_4_ + -1.0 + auVar188._0_4_;
                fVar228 = auVar101._4_4_ + -1.0 + auVar188._4_4_;
                fVar229 = auVar101._8_4_ + -1.0 + auVar188._8_4_;
                fVar230 = auVar101._12_4_ + -1.0 + auVar188._12_4_;
                auVar188 = vandps_avx(auVar270,auVar100);
                auVar270 = vsubps_avx(auVar307,auVar188);
                auVar188 = vcmpps_avx(auVar274,_DAT_004ee060,2);
                auVar139._0_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar270._0_4_ * 0.6931472 + fVar227) * -2.0;
                auVar139._4_4_ =
                     (fVar228 * fVar228 *
                      (((((((((fVar228 * 0.070376836 + -0.1151461) * fVar228 + 0.116769984) *
                             fVar228 + -0.12420141) * fVar228 + 0.14249323) * fVar228 + -0.16668057)
                          * fVar228 + 0.20000714) * fVar228 + -0.24999994) * fVar228 + 0.3333333) *
                       fVar228 + -0.5) + auVar270._4_4_ * 0.6931472 + fVar228) * -2.0;
                auVar139._8_4_ =
                     (fVar229 * fVar229 *
                      (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                             fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 + -0.16668057)
                          * fVar229 + 0.20000714) * fVar229 + -0.24999994) * fVar229 + 0.3333333) *
                       fVar229 + -0.5) + auVar270._8_4_ * 0.6931472 + fVar229) * -2.0;
                auVar139._12_4_ =
                     (fVar230 * fVar230 *
                      (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                             fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057)
                          * fVar230 + 0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) *
                       fVar230 + -0.5) + auVar270._12_4_ * 0.6931472 + fVar230) * -2.0;
                auVar193._8_4_ = 0x7fffffff;
                auVar193._0_8_ = 0x7fffffff7fffffff;
                auVar193._12_4_ = 0x7fffffff;
                auVar188 = vblendvps_avx(auVar139,auVar193,auVar188);
                auVar194._8_4_ = 0x42b0c0a5;
                auVar194._0_8_ = 0x42b0c0a542b0c0a5;
                auVar194._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar194);
                auVar195._8_4_ = 0xc2b0c0a5;
                auVar195._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar195._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar195);
                auVar196._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar196._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar196._8_4_ = auVar307._8_4_ * 1.442695 + fVar131;
                auVar196._12_4_ = auVar307._12_4_ * 1.442695 + fVar231;
                auVar275._0_4_ = (int)auVar196._0_4_;
                auVar275._4_4_ = (int)auVar196._4_4_;
                auVar275._8_4_ = (int)auVar196._8_4_;
                auVar275._12_4_ = (int)auVar196._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar275);
                auVar188 = vcmpps_avx(auVar196,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar276._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar276._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar276._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar276._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar332 = ZEXT1664(auVar100);
                auVar270 = vsubps_avx(auVar307,auVar276);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar98 = ZEXT864(0) << 0x20;
                auVar353 = ZEXT1664(auVar353._0_16_);
                auVar197._0_4_ = (int)auVar188._0_4_;
                auVar197._4_4_ = (int)auVar188._4_4_;
                auVar197._8_4_ = (int)auVar188._8_4_;
                auVar197._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar197,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar140._0_4_ =
                     (fVar227 + fVar93 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226) *
                     fVar227 * fVar227) * auVar188._0_4_ + fVar93;
                auVar140._4_4_ =
                     (fVar228 + fVar133 +
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132) *
                     fVar228 * fVar228) * auVar188._4_4_ + fVar133;
                auVar140._8_4_ =
                     (fVar229 + fVar99 +
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar131) *
                     fVar229 * fVar229) * auVar188._8_4_ + fVar99;
                auVar140._12_4_ =
                     (fVar230 + fVar134 +
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar231) *
                     fVar230 * fVar230) * auVar188._12_4_ + fVar134;
                auVar188 = vrcpps_avx(auVar140);
                fVar93 = auVar188._0_4_;
                fVar132 = auVar188._4_4_;
                fVar133 = auVar188._8_4_;
                fVar99 = auVar188._12_4_;
                auVar141._0_4_ = auVar140._0_4_ * (fVar93 + fVar93);
                auVar141._4_4_ = auVar140._4_4_ * (fVar132 + fVar132);
                auVar141._8_4_ = auVar140._8_4_ * (fVar133 + fVar133);
                auVar141._12_4_ = auVar140._12_4_ * (fVar99 + fVar99);
                auVar235._8_4_ = 0x40000000;
                auVar235._0_8_ = 0x4000000040000000;
                auVar235._12_4_ = 0x40000000;
                auVar188 = vsubps_avx(auVar235,auVar141);
                auVar142._0_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar188._0_4_;
                auVar142._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar188._4_4_;
                auVar142._8_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar188._8_4_;
                auVar142._12_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar188._12_4_;
                goto LAB_00266edf;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar145._0_4_ = fVar93 * auVar306._0_4_ + fVar132;
                auVar145._4_4_ = fVar93 * auVar306._4_4_ + fVar132;
                auVar145._8_4_ = fVar93 * fVar233 + fVar132;
                auVar145._12_4_ = fVar93 * fVar187 + fVar132;
                auVar188 = vmaxps_avx(auVar145,auVar270);
                auVar142 = vminps_avx(auVar188,auVar100);
LAB_00266edf:
                auVar280._0_4_ = auVar142._0_4_ * auVar306._0_4_;
                auVar280._4_4_ = auVar142._4_4_ * auVar306._4_4_;
                auVar280._8_4_ = auVar142._8_4_ * fVar233;
                auVar280._12_4_ = auVar142._12_4_ * fVar187;
              }
              auVar188 = auVar280;
LAB_00266ee7:
              *(undefined1 (*) [16])local_238 = auVar188;
              local_238 = local_238 + 2;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 1) && (_elempack == 8)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar79;
        }
        auVar311 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                      CONCAT424(0x42b0c0a5,
                                                CONCAT420(0x42b0c0a5,
                                                          CONCAT416(0x42b0c0a5,
                                                                    CONCAT412(0x42b0c0a5,
                                                                              CONCAT48(0x42b0c0a5,
                                                                                                                                                                              
                                                  0x42b0c0a542b0c0a5)))))));
        auVar313 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar316 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar353 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar306 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar324 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar333 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar354 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar98 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                     CONCAT424(0x3d2aa9c1,
                                               CONCAT420(0x3d2aa9c1,
                                                         CONCAT416(0x3d2aa9c1,
                                                                   CONCAT412(0x3d2aa9c1,
                                                                             CONCAT48(0x3d2aa9c1,
                                                                                                                                                                            
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar376 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
        for (; uVar79 != uVar78; uVar79 = uVar79 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar79 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar62 = 0;
          uVar67 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar67 = uVar62;
          }
          uVar74 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar74 = 0;
          }
          uVar77 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar77 = 0;
          }
          for (; uVar62 != uVar77; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar81 = 0; uVar81 != uVar74; uVar81 = uVar81 + 1) {
              if (lVar75 == 0) {
                auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar342 = ZEXT3264(*(undefined1 (*) [32])(lVar75 + uVar79 * 0x20));
              }
              pvVar59 = (void *)((this->weight_data_tm).cstep * uVar79 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar69 = 0; uVar69 != uVar67; uVar69 = uVar69 + 1) {
                pvVar61 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar69 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar61;
                pvVar71 = pvVar59;
                for (uVar82 = 0; uVar82 != uVar89; uVar82 = uVar82 + 1) {
                  iVar54 = (((int)uVar82 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    iVar54 = iVar57;
                    for (lVar63 = 0; uVar68 * 0x20 != lVar63; lVar63 = lVar63 + 0x20) {
                      if (((-1 < iVar54) && (iVar56 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar56 < iVar83)) {
                        fVar93 = *(float *)((long)pvVar61 +
                                           (long)iVar56 * 4 +
                                           (long)iVar55 *
                                           (long)bottom_blob->w * bottom_blob->elemsize);
                        pfVar84 = (float *)((long)pvVar71 + lVar63);
                        auVar342 = ZEXT3264(CONCAT428(auVar342._28_4_ + fVar93,
                                                      CONCAT424(auVar342._24_4_ +
                                                                fVar93 * pfVar84[6],
                                                                CONCAT420(auVar342._20_4_ +
                                                                          fVar93 * pfVar84[5],
                                                                          CONCAT416(auVar342._16_4_
                                                                                    + fVar93 * 
                                                  pfVar84[4],
                                                  CONCAT412(auVar342._12_4_ + fVar93 * pfVar84[3],
                                                            CONCAT48(auVar342._8_4_ +
                                                                     fVar93 * pfVar84[2],
                                                                     CONCAT44(auVar342._4_4_ +
                                                                              fVar93 * pfVar84[1],
                                                                              auVar342._0_4_ +
                                                                              fVar93 * *pfVar84)))))
                                                  )));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  pvVar71 = (void *)((long)pvVar71 + (long)(int)uVar12 * 0x20);
                }
                pvVar59 = (void *)((long)pvVar59 + (long)(int)(uVar12 * uVar13 * 8) * 4);
              }
              auVar251 = auVar342._0_32_;
              auVar260 = auVar251;
              if (5 < iVar73 - 1U) goto switchD_002672a4_caseD_1;
              auVar178 = auVar332._0_32_;
              auVar260 = vmaxps_avx(auVar251,auVar178);
              fVar343 = auVar342._8_4_;
              fVar344 = auVar342._12_4_;
              fVar345 = auVar342._16_4_;
              fVar346 = auVar342._20_4_;
              fVar347 = auVar342._24_4_;
              fVar244 = auVar316._0_4_;
              fVar264 = auVar316._4_4_;
              fVar265 = auVar316._8_4_;
              fVar266 = auVar316._12_4_;
              fVar267 = auVar316._16_4_;
              fVar268 = auVar316._20_4_;
              fVar269 = auVar316._24_4_;
              auVar302 = auVar306._0_32_;
              fVar314 = auVar324._0_4_;
              fVar317 = auVar324._4_4_;
              fVar318 = auVar324._8_4_;
              fVar319 = auVar324._12_4_;
              fVar320 = auVar324._16_4_;
              fVar321 = auVar324._20_4_;
              fVar322 = auVar324._24_4_;
              fVar323 = auVar333._0_4_;
              fVar325 = auVar333._4_4_;
              fVar326 = auVar333._8_4_;
              fVar327 = auVar333._12_4_;
              fVar328 = auVar333._16_4_;
              fVar329 = auVar333._20_4_;
              fVar330 = auVar333._24_4_;
              fVar331 = auVar354._0_4_;
              fVar334 = auVar354._4_4_;
              fVar335 = auVar354._8_4_;
              fVar336 = auVar354._12_4_;
              fVar337 = auVar354._16_4_;
              fVar338 = auVar354._20_4_;
              fVar339 = auVar354._24_4_;
              fVar348 = auVar376._0_4_;
              fVar355 = auVar376._4_4_;
              fVar356 = auVar376._8_4_;
              fVar357 = auVar376._12_4_;
              fVar358 = auVar376._16_4_;
              fVar359 = auVar376._20_4_;
              fVar360 = auVar376._24_4_;
              auVar97 = auVar311._0_32_;
              auVar221 = auVar313._0_32_;
              fVar131 = auVar353._4_4_;
              fVar231 = auVar353._8_4_;
              fVar227 = auVar353._12_4_;
              fVar232 = auVar353._16_4_;
              fVar377 = auVar353._20_4_;
              fVar380 = auVar353._24_4_;
              fVar22 = auVar353._28_4_;
              fVar93 = auVar98._0_4_;
              fVar134 = auVar98._4_4_;
              fVar233 = auVar98._8_4_;
              fVar226 = auVar98._12_4_;
              fVar230 = auVar98._16_4_;
              fVar378 = auVar98._20_4_;
              fVar381 = auVar98._24_4_;
              fVar99 = auVar306._4_4_;
              fVar187 = auVar306._8_4_;
              fVar228 = auVar306._12_4_;
              fVar229 = auVar306._16_4_;
              fVar379 = auVar306._20_4_;
              fVar382 = auVar306._24_4_;
              fVar21 = auVar306._28_4_;
              fVar132 = auVar306._0_4_;
              fVar133 = auVar353._0_4_;
              switch(iVar73) {
              case 2:
                auVar251 = vminps_avx(auVar251,auVar178);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar258._0_4_ = fVar93 * auVar251._0_4_ + auVar260._0_4_;
                auVar258._4_4_ = fVar93 * auVar251._4_4_ + auVar260._4_4_;
                auVar258._8_4_ = fVar93 * auVar251._8_4_ + auVar260._8_4_;
                auVar258._12_4_ = fVar93 * auVar251._12_4_ + auVar260._12_4_;
                auVar258._16_4_ = fVar93 * auVar251._16_4_ + auVar260._16_4_;
                auVar258._20_4_ = fVar93 * auVar251._20_4_ + auVar260._20_4_;
                auVar258._24_4_ = fVar93 * auVar251._24_4_ + auVar260._24_4_;
                auVar258._28_4_ = auVar251._28_4_ + auVar260._28_4_;
                auVar260 = auVar258;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar261._4_4_ = uVar94;
                auVar261._0_4_ = uVar94;
                auVar261._8_4_ = uVar94;
                auVar261._12_4_ = uVar94;
                auVar261._16_4_ = uVar94;
                auVar261._20_4_ = uVar94;
                auVar261._24_4_ = uVar94;
                auVar261._28_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar375._4_4_ = uVar94;
                auVar375._0_4_ = uVar94;
                auVar375._8_4_ = uVar94;
                auVar375._12_4_ = uVar94;
                auVar375._16_4_ = uVar94;
                auVar375._20_4_ = uVar94;
                auVar375._24_4_ = uVar94;
                auVar375._28_4_ = uVar94;
                auVar251 = vmaxps_avx(auVar251,auVar261);
                auVar260 = vminps_avx(auVar375,auVar251);
                break;
              case 4:
                auVar262._0_8_ = auVar342._0_8_ ^ 0x8000000080000000;
                auVar262._8_4_ = -fVar343;
                auVar262._12_4_ = -fVar344;
                auVar262._16_4_ = -fVar345;
                auVar262._20_4_ = -fVar346;
                auVar262._24_4_ = -fVar347;
                auVar262._28_4_ = -auVar342._28_4_;
                auVar251 = vminps_avx(auVar262,auVar97);
                auVar178 = vmaxps_avx(auVar221,auVar251);
                auVar341._0_4_ = fVar244 * auVar178._0_4_ + fVar133;
                auVar341._4_4_ = fVar264 * auVar178._4_4_ + fVar131;
                auVar341._8_4_ = fVar265 * auVar178._8_4_ + fVar231;
                auVar341._12_4_ = fVar266 * auVar178._12_4_ + fVar227;
                auVar341._16_4_ = fVar267 * auVar178._16_4_ + fVar232;
                auVar341._20_4_ = fVar268 * auVar178._20_4_ + fVar377;
                auVar341._24_4_ = fVar269 * auVar178._24_4_ + fVar380;
                auVar341._28_4_ = auVar342._28_4_ + fVar22;
                auVar97 = vroundps_avx(auVar341,1);
                auVar251 = vcmpps_avx(auVar341,auVar97,1);
                auVar251 = vandps_avx(auVar251,auVar302);
                auVar251 = vsubps_avx(auVar97,auVar251);
                fVar244 = auVar251._0_4_ * -0.6931472 + auVar178._0_4_;
                fVar264 = auVar251._4_4_ * -0.6931472 + auVar178._4_4_;
                fVar265 = auVar251._8_4_ * -0.6931472 + auVar178._8_4_;
                fVar266 = auVar251._12_4_ * -0.6931472 + auVar178._12_4_;
                fVar267 = auVar251._16_4_ * -0.6931472 + auVar178._16_4_;
                fVar268 = auVar251._20_4_ * -0.6931472 + auVar178._20_4_;
                fVar269 = auVar251._24_4_ * -0.6931472 + auVar178._24_4_;
                auVar250._0_4_ = (int)auVar251._0_4_;
                auVar250._4_4_ = (int)auVar251._4_4_;
                auVar250._8_4_ = (int)auVar251._8_4_;
                auVar250._12_4_ = (int)auVar251._12_4_;
                auVar263._16_4_ = (int)auVar251._16_4_;
                auVar263._0_16_ = auVar250;
                auVar263._20_4_ = (int)auVar251._20_4_;
                auVar263._24_4_ = (int)auVar251._24_4_;
                auVar263._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar250,0x17);
                auVar188 = vpslld_avx(auVar263._16_16_,0x17);
                auVar148._8_4_ = 0x3f800000;
                auVar148._0_8_ = 0x3f8000003f800000;
                auVar148._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar148);
                auVar270 = vpaddd_avx(auVar270,auVar148);
                auVar129._0_4_ =
                     (fVar244 + fVar132 +
                     fVar244 * fVar244 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar244) * fVar244) * fVar244 + fVar93) *
                      fVar244) * fVar244 + fVar133)) * auVar270._0_4_ + fVar132;
                auVar129._4_4_ =
                     (fVar264 + fVar99 +
                     fVar264 * fVar264 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar264) * fVar264) * fVar264 + fVar134) *
                      fVar264) * fVar264 + fVar131)) * auVar270._4_4_ + fVar99;
                auVar129._8_4_ =
                     (fVar265 + fVar187 +
                     fVar265 * fVar265 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar265) * fVar265) * fVar265 + fVar233) *
                      fVar265) * fVar265 + fVar231)) * auVar270._8_4_ + fVar187;
                auVar129._12_4_ =
                     (fVar266 + fVar228 +
                     fVar266 * fVar266 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar266) * fVar266) * fVar266 + fVar226) *
                      fVar266) * fVar266 + fVar227)) * auVar270._12_4_ + fVar228;
                auVar129._16_4_ =
                     (fVar267 + fVar229 +
                     fVar267 * fVar267 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar267) * fVar267) * fVar267 + fVar230) *
                      fVar267) * fVar267 + fVar232)) * auVar188._0_4_ + fVar229;
                auVar129._20_4_ =
                     (fVar268 + fVar379 +
                     fVar268 * fVar268 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar268) * fVar268) * fVar268 + fVar378) *
                      fVar268) * fVar268 + fVar377)) * auVar188._4_4_ + fVar379;
                auVar129._24_4_ =
                     (fVar269 + fVar382 +
                     fVar269 * fVar269 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar269) * fVar269) * fVar269 + fVar381) *
                      fVar269) * fVar269 + fVar380)) * auVar188._8_4_ + fVar382;
                auVar129._28_4_ =
                     auVar97._28_4_ + auVar178._28_4_ + fVar21 +
                     auVar376._28_4_ +
                     auVar354._28_4_ + auVar333._28_4_ + -0.6931472 + auVar98._28_4_ + fVar22 +
                     fVar21;
                auVar251 = vrcpps_avx(auVar129);
                fVar93 = auVar251._0_4_;
                fVar132 = auVar251._4_4_;
                auVar43._4_4_ = auVar129._4_4_ * fVar132;
                auVar43._0_4_ = auVar129._0_4_ * fVar93;
                fVar133 = auVar251._8_4_;
                auVar43._8_4_ = auVar129._8_4_ * fVar133;
                fVar99 = auVar251._12_4_;
                auVar43._12_4_ = auVar129._12_4_ * fVar99;
                fVar131 = auVar251._16_4_;
                auVar43._16_4_ = auVar129._16_4_ * fVar131;
                fVar134 = auVar251._20_4_;
                auVar43._20_4_ = auVar129._20_4_ * fVar134;
                fVar231 = auVar251._24_4_;
                auVar43._24_4_ = auVar129._24_4_ * fVar231;
                auVar43._28_4_ = auVar129._28_4_;
                auVar178 = vsubps_avx(auVar302,auVar43);
                auVar260._0_4_ = fVar93 + fVar93 * auVar178._0_4_;
                auVar260._4_4_ = fVar132 + fVar132 * auVar178._4_4_;
                auVar260._8_4_ = fVar133 + fVar133 * auVar178._8_4_;
                auVar260._12_4_ = fVar99 + fVar99 * auVar178._12_4_;
                auVar260._16_4_ = fVar131 + fVar131 * auVar178._16_4_;
                auVar260._20_4_ = fVar134 + fVar134 * auVar178._20_4_;
                auVar260._24_4_ = fVar231 + fVar231 * auVar178._24_4_;
                auVar260._28_4_ = auVar251._28_4_ + auVar178._28_4_;
                break;
              case 5:
                auVar251 = vminps_avx(auVar251,auVar97);
                auVar178 = vmaxps_avx(auVar221,auVar251);
                auVar259._0_4_ = fVar244 * auVar178._0_4_ + fVar133;
                auVar259._4_4_ = fVar264 * auVar178._4_4_ + fVar131;
                auVar259._8_4_ = fVar265 * auVar178._8_4_ + fVar231;
                auVar259._12_4_ = fVar266 * auVar178._12_4_ + fVar227;
                auVar259._16_4_ = fVar267 * auVar178._16_4_ + fVar232;
                auVar259._20_4_ = fVar268 * auVar178._20_4_ + fVar377;
                auVar259._24_4_ = fVar269 * auVar178._24_4_ + fVar380;
                auVar259._28_4_ = auVar260._28_4_ + fVar22;
                auVar30 = vroundps_avx(auVar259,1);
                auVar251 = vcmpps_avx(auVar259,auVar30,1);
                auVar251 = vandps_avx(auVar251,auVar302);
                auVar251 = vsubps_avx(auVar30,auVar251);
                auVar39._4_4_ = auVar251._4_4_ * 0.6931472;
                auVar39._0_4_ = auVar251._0_4_ * 0.6931472;
                auVar39._8_4_ = auVar251._8_4_ * 0.6931472;
                auVar39._12_4_ = auVar251._12_4_ * 0.6931472;
                auVar39._16_4_ = auVar251._16_4_ * 0.6931472;
                auVar39._20_4_ = auVar251._20_4_ * 0.6931472;
                auVar39._24_4_ = auVar251._24_4_ * 0.6931472;
                auVar39._28_4_ = auVar30._28_4_;
                auVar178 = vsubps_avx(auVar178,auVar39);
                fVar23 = auVar178._0_4_;
                fVar24 = auVar178._4_4_;
                fVar25 = auVar178._8_4_;
                fVar26 = auVar178._12_4_;
                fVar27 = auVar178._16_4_;
                fVar28 = auVar178._20_4_;
                fVar29 = auVar178._24_4_;
                auVar146._0_4_ = (int)auVar251._0_4_;
                auVar146._4_4_ = (int)auVar251._4_4_;
                auVar146._8_4_ = (int)auVar251._8_4_;
                auVar146._12_4_ = (int)auVar251._12_4_;
                auVar183._16_4_ = (int)auVar251._16_4_;
                auVar183._0_16_ = auVar146;
                auVar183._20_4_ = (int)auVar251._20_4_;
                auVar183._24_4_ = (int)auVar251._24_4_;
                auVar183._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar146,0x17);
                auVar188 = vpslld_avx(auVar183._16_16_,0x17);
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = 0x3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar198);
                auVar270 = vpaddd_avx(auVar270,auVar198);
                local_168._0_4_ =
                     (fVar23 + fVar132 +
                     fVar23 * fVar23 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar23) * fVar23) * fVar23 + fVar93) * fVar23
                      ) * fVar23 + fVar133)) * auVar270._0_4_ + fVar132;
                local_168._4_4_ =
                     (fVar24 + fVar99 +
                     fVar24 * fVar24 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar24) * fVar24) * fVar24 + fVar134) *
                      fVar24) * fVar24 + fVar131)) * auVar270._4_4_ + fVar99;
                local_168._8_4_ =
                     (fVar25 + fVar187 +
                     fVar25 * fVar25 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar25) * fVar25) * fVar25 + fVar233) *
                      fVar25) * fVar25 + fVar231)) * auVar270._8_4_ + fVar187;
                local_168._12_4_ =
                     (fVar26 + fVar228 +
                     fVar26 * fVar26 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar26) * fVar26) * fVar26 + fVar226) *
                      fVar26) * fVar26 + fVar227)) * auVar270._12_4_ + fVar228;
                local_168._16_4_ =
                     (fVar27 + fVar229 +
                     fVar27 * fVar27 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar27) * fVar27) * fVar27 + fVar230) *
                      fVar27) * fVar27 + fVar232)) * auVar188._0_4_ + fVar229;
                local_168._20_4_ =
                     (fVar28 + fVar379 +
                     fVar28 * fVar28 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar28) * fVar28) * fVar28 + fVar378) *
                      fVar28) * fVar28 + fVar377)) * auVar188._4_4_ + fVar379;
                local_168._24_4_ =
                     (fVar29 + fVar382 +
                     fVar29 * fVar29 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar29) * fVar29) * fVar29 + fVar381) *
                      fVar29) * fVar29 + fVar380)) * auVar188._8_4_ + fVar382;
                local_168._28_4_ =
                     auVar178._28_4_ + fVar21 +
                     auVar376._28_4_ +
                     auVar354._28_4_ + auVar333._28_4_ + 0.6931472 + auVar98._28_4_ + fVar22 +
                     fVar21;
                auVar126._8_4_ = 0x800000;
                auVar126._0_8_ = 0x80000000800000;
                auVar126._12_4_ = 0x800000;
                auVar126._16_4_ = 0x800000;
                auVar126._20_4_ = 0x800000;
                auVar126._24_4_ = 0x800000;
                auVar126._28_4_ = 0x800000;
                auVar302 = vmaxps_avx(local_168,auVar126);
                auVar188 = vpsrld_avx(auVar302._16_16_,0x17);
                auVar224._8_4_ = 0x807fffff;
                auVar224._0_8_ = 0x807fffff807fffff;
                auVar224._12_4_ = 0x807fffff;
                auVar224._16_4_ = 0x807fffff;
                auVar224._20_4_ = 0x807fffff;
                auVar224._24_4_ = 0x807fffff;
                auVar224._28_4_ = 0x807fffff;
                auVar251 = vandps_avx(auVar302,auVar224);
                auVar30 = vorps_avx(auVar251,auVar353._0_32_);
                auVar225._8_4_ = 0x3f3504f3;
                auVar225._0_8_ = 0x3f3504f33f3504f3;
                auVar225._12_4_ = 0x3f3504f3;
                auVar225._16_4_ = 0x3f3504f3;
                auVar225._20_4_ = 0x3f3504f3;
                auVar225._24_4_ = 0x3f3504f3;
                auVar225._28_4_ = 0x3f3504f3;
                auVar178 = vcmpps_avx(auVar225,auVar30,2);
                auVar251 = vandnps_avx(auVar178,auVar30);
                fVar132 = auVar30._0_4_ + -1.0 + auVar251._0_4_;
                fVar99 = auVar30._4_4_ + -1.0 + auVar251._4_4_;
                fVar187 = auVar30._8_4_ + -1.0 + auVar251._8_4_;
                fVar228 = auVar30._12_4_ + -1.0 + auVar251._12_4_;
                fVar229 = auVar30._16_4_ + -1.0 + auVar251._16_4_;
                fVar379 = auVar30._20_4_ + -1.0 + auVar251._20_4_;
                fVar382 = auVar30._24_4_ + -1.0 + auVar251._24_4_;
                auVar188 = vpsubd_avx(auVar188,auVar178._16_16_);
                auVar311 = ZEXT3264(auVar97);
                auVar313 = ZEXT3264(auVar221);
                auVar316 = ZEXT3264(auVar316._0_32_);
                auVar324 = ZEXT3264(auVar324._0_32_);
                auVar333 = ZEXT3264(auVar333._0_32_);
                auVar354 = ZEXT3264(auVar354._0_32_);
                auVar98 = ZEXT3264(auVar98._0_32_);
                auVar353 = ZEXT3264(auVar353._0_32_);
                auVar376 = ZEXT3264(auVar376._0_32_);
                auVar243._8_4_ = 0x3f800000;
                auVar243._0_8_ = 0x3f8000003f800000;
                auVar243._12_4_ = 0x3f800000;
                auVar243._16_4_ = 0x3f800000;
                auVar243._20_4_ = 0x3f800000;
                auVar243._24_4_ = 0x3f800000;
                auVar243._28_4_ = 0x3f800000;
                auVar306 = ZEXT3264(auVar243);
                auVar270 = vpsrld_avx(auVar302._0_16_,0x17);
                auVar248._8_4_ = 0xffffff81;
                auVar248._0_8_ = 0xffffff81ffffff81;
                auVar248._12_4_ = 0xffffff81;
                auVar188 = vpaddd_avx(auVar188,auVar248);
                auVar270 = vpsubd_avx(auVar270,auVar178._0_16_);
                auVar270 = vpaddd_avx(auVar270,auVar248);
                auVar127._16_16_ = auVar188;
                auVar127._0_16_ = auVar270;
                auVar178 = vcmpps_avx(local_168,_DAT_004f2e40,2);
                auVar302 = vcvtdq2ps_avx(auVar127);
                auVar40._4_4_ =
                     (fVar99 + auVar302._4_4_ * 0.6931472 +
                     fVar99 * fVar99 *
                     (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 * (fVar99 *
                                                                                            (fVar99 
                                                  * 0.070376836 + -0.1151461) + 0.116769984) +
                                                  -0.12420141) + 0.14249323) + -0.16668057) +
                                                  0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                     -2.0;
                auVar40._0_4_ =
                     (fVar132 + auVar302._0_4_ * 0.6931472 +
                     fVar132 * fVar132 *
                     (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (fVar132 * (
                                                  fVar132 * (fVar132 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._8_4_ =
                     (fVar187 + auVar302._8_4_ * 0.6931472 +
                     fVar187 * fVar187 *
                     (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (
                                                  fVar187 * (fVar187 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._12_4_ =
                     (fVar228 + auVar302._12_4_ * 0.6931472 +
                     fVar228 * fVar228 *
                     (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (fVar228 * (
                                                  fVar228 * (fVar228 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._16_4_ =
                     (fVar229 + auVar302._16_4_ * 0.6931472 +
                     fVar229 * fVar229 *
                     (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (
                                                  fVar229 * (fVar229 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._20_4_ =
                     (fVar379 + auVar302._20_4_ * 0.6931472 +
                     fVar379 * fVar379 *
                     (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (fVar379 * (
                                                  fVar379 * (fVar379 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._24_4_ =
                     (fVar382 + auVar302._24_4_ * 0.6931472 +
                     fVar382 * fVar382 *
                     (fVar382 * (fVar382 * (fVar382 * (fVar382 * (fVar382 * (fVar382 * (fVar382 * (
                                                  fVar382 * (fVar382 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar40._28_4_ = auVar30._28_4_ + -1.0 + auVar251._28_4_ + auVar302._28_4_ + 0.0;
                auVar184._8_4_ = 0x7fffffff;
                auVar184._0_8_ = 0x7fffffff7fffffff;
                auVar184._12_4_ = 0x7fffffff;
                auVar184._16_4_ = 0x7fffffff;
                auVar184._20_4_ = 0x7fffffff;
                auVar184._24_4_ = 0x7fffffff;
                auVar184._28_4_ = 0x7fffffff;
                auVar251 = vblendvps_avx(auVar40,auVar184,auVar178);
                auVar251 = vminps_avx(auVar251,auVar97);
                auVar178 = vmaxps_avx(auVar221,auVar251);
                auVar185._0_4_ = fVar244 * auVar178._0_4_ + fVar133;
                auVar185._4_4_ = fVar264 * auVar178._4_4_ + fVar131;
                auVar185._8_4_ = fVar265 * auVar178._8_4_ + fVar231;
                auVar185._12_4_ = fVar266 * auVar178._12_4_ + fVar227;
                auVar185._16_4_ = fVar267 * auVar178._16_4_ + fVar232;
                auVar185._20_4_ = fVar268 * auVar178._20_4_ + fVar377;
                auVar185._24_4_ = fVar269 * auVar178._24_4_ + fVar380;
                auVar185._28_4_ = fVar22 + NAN;
                auVar302 = vroundps_avx(auVar185,1);
                auVar251 = vcmpps_avx(auVar185,auVar302,1);
                auVar251 = vandps_avx(auVar251,auVar243);
                auVar251 = vsubps_avx(auVar302,auVar251);
                auVar41._4_4_ = auVar251._4_4_ * 0.6931472;
                auVar41._0_4_ = auVar251._0_4_ * 0.6931472;
                auVar41._8_4_ = auVar251._8_4_ * 0.6931472;
                auVar41._12_4_ = auVar251._12_4_ * 0.6931472;
                auVar41._16_4_ = auVar251._16_4_ * 0.6931472;
                auVar41._20_4_ = auVar251._20_4_ * 0.6931472;
                auVar41._24_4_ = auVar251._24_4_ * 0.6931472;
                auVar41._28_4_ = auVar302._28_4_;
                auVar178 = vsubps_avx(auVar178,auVar41);
                fVar132 = auVar178._0_4_;
                fVar99 = auVar178._4_4_;
                fVar187 = auVar178._8_4_;
                fVar228 = auVar178._12_4_;
                fVar229 = auVar178._16_4_;
                fVar379 = auVar178._20_4_;
                fVar382 = auVar178._24_4_;
                auVar147._0_4_ = (int)auVar251._0_4_;
                auVar147._4_4_ = (int)auVar251._4_4_;
                auVar147._8_4_ = (int)auVar251._8_4_;
                auVar147._12_4_ = (int)auVar251._12_4_;
                auVar186._16_4_ = (int)auVar251._16_4_;
                auVar186._0_16_ = auVar147;
                auVar186._20_4_ = (int)auVar251._20_4_;
                auVar186._24_4_ = (int)auVar251._24_4_;
                auVar186._28_4_ = (int)auVar251._28_4_;
                auVar270 = vpslld_avx(auVar147,0x17);
                auVar188 = vpslld_avx(auVar186._16_16_,0x17);
                auVar249._8_4_ = 0x3f800000;
                auVar249._0_8_ = 0x3f8000003f800000;
                auVar249._12_4_ = 0x3f800000;
                auVar188 = vpaddd_avx(auVar188,auVar249);
                auVar270 = vpaddd_avx(auVar270,auVar249);
                auVar128._0_4_ =
                     (fVar132 + 1.0 +
                     fVar132 * fVar132 *
                     ((fVar348 +
                      ((fVar331 + (fVar323 + fVar314 * fVar132) * fVar132) * fVar132 + fVar93) *
                      fVar132) * fVar132 + fVar133)) * auVar270._0_4_ + 1.0;
                auVar128._4_4_ =
                     (fVar99 + 1.0 +
                     fVar99 * fVar99 *
                     ((fVar355 +
                      ((fVar334 + (fVar325 + fVar317 * fVar99) * fVar99) * fVar99 + fVar134) *
                      fVar99) * fVar99 + fVar131)) * auVar270._4_4_ + 1.0;
                auVar128._8_4_ =
                     (fVar187 + 1.0 +
                     fVar187 * fVar187 *
                     ((fVar356 +
                      ((fVar335 + (fVar326 + fVar318 * fVar187) * fVar187) * fVar187 + fVar233) *
                      fVar187) * fVar187 + fVar231)) * auVar270._8_4_ + 1.0;
                auVar128._12_4_ =
                     (fVar228 + 1.0 +
                     fVar228 * fVar228 *
                     ((fVar357 +
                      ((fVar336 + (fVar327 + fVar319 * fVar228) * fVar228) * fVar228 + fVar226) *
                      fVar228) * fVar228 + fVar227)) * auVar270._12_4_ + 1.0;
                auVar128._16_4_ =
                     (fVar229 + 1.0 +
                     fVar229 * fVar229 *
                     ((fVar358 +
                      ((fVar337 + (fVar328 + fVar320 * fVar229) * fVar229) * fVar229 + fVar230) *
                      fVar229) * fVar229 + fVar232)) * auVar188._0_4_ + 1.0;
                auVar128._20_4_ =
                     (fVar379 + 1.0 +
                     fVar379 * fVar379 *
                     ((fVar359 +
                      ((fVar338 + (fVar329 + fVar321 * fVar379) * fVar379) * fVar379 + fVar378) *
                      fVar379) * fVar379 + fVar377)) * auVar188._4_4_ + 1.0;
                auVar128._24_4_ =
                     (fVar382 + 1.0 +
                     fVar382 * fVar382 *
                     ((fVar360 +
                      ((fVar339 + (fVar330 + fVar322 * fVar382) * fVar382) * fVar382 + fVar381) *
                      fVar382) * fVar382 + fVar380)) * auVar188._8_4_ + 1.0;
                auVar128._28_4_ = auVar178._28_4_ + 1.0 + auVar302._28_4_ + 1.0;
                auVar251 = vrcpps_avx(auVar128);
                fVar93 = auVar251._0_4_;
                fVar132 = auVar251._4_4_;
                fVar133 = auVar251._8_4_;
                fVar99 = auVar251._12_4_;
                fVar131 = auVar251._16_4_;
                fVar134 = auVar251._20_4_;
                fVar231 = auVar251._24_4_;
                auVar42._4_4_ = auVar128._4_4_ * (fVar132 + fVar132);
                auVar42._0_4_ = auVar128._0_4_ * (fVar93 + fVar93);
                auVar42._8_4_ = auVar128._8_4_ * (fVar133 + fVar133);
                auVar42._12_4_ = auVar128._12_4_ * (fVar99 + fVar99);
                auVar42._16_4_ = auVar128._16_4_ * (fVar131 + fVar131);
                auVar42._20_4_ = auVar128._20_4_ * (fVar134 + fVar134);
                auVar42._24_4_ = auVar128._24_4_ * (fVar231 + fVar231);
                auVar42._28_4_ = auVar128._28_4_;
                auVar260._8_4_ = 2.0;
                auVar260._0_8_ = 0x4000000040000000;
                auVar260._12_4_ = 2.0;
                auVar260._16_4_ = 2.0;
                auVar260._20_4_ = 2.0;
                auVar260._24_4_ = 2.0;
                auVar260._28_4_ = 2.0;
                auVar251 = vsubps_avx(auVar260,auVar42);
                auVar332 = ZEXT464(0) << 0x20;
                auVar119._0_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar251._0_4_;
                auVar119._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar251._4_4_;
                auVar119._8_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar251._8_4_;
                auVar119._12_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar251._12_4_;
                auVar119._16_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar251._16_4_;
                auVar119._20_4_ = fVar134 + fVar134 + -1.0 + fVar134 * auVar251._20_4_;
                auVar119._24_4_ = fVar231 + fVar231 + -1.0 + fVar231 * auVar251._24_4_;
                goto LAB_00267716;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar130._0_4_ = auVar342._0_4_ * fVar93 + fVar132;
                auVar130._4_4_ = auVar342._4_4_ * fVar93 + fVar132;
                auVar130._8_4_ = fVar343 * fVar93 + fVar132;
                auVar130._12_4_ = fVar344 * fVar93 + fVar132;
                auVar130._16_4_ = fVar345 * fVar93 + fVar132;
                auVar130._20_4_ = fVar346 * fVar93 + fVar132;
                auVar130._24_4_ = fVar347 * fVar93 + fVar132;
                auVar130._28_4_ = fVar93 + fVar132;
                auVar251 = vmaxps_avx(auVar130,auVar178);
                auVar251 = vminps_avx(auVar251,auVar302);
                auVar119 = auVar251._0_28_;
LAB_00267716:
                auVar50._4_4_ = auVar342._4_4_ * auVar119._4_4_;
                auVar50._0_4_ = auVar342._0_4_ * auVar119._0_4_;
                auVar50._8_4_ = fVar343 * auVar119._8_4_;
                auVar50._12_4_ = fVar344 * auVar119._12_4_;
                auVar50._16_4_ = fVar345 * auVar119._16_4_;
                auVar50._20_4_ = fVar346 * auVar119._20_4_;
                auVar50._24_4_ = fVar347 * auVar119._24_4_;
                auVar50._28_4_ = auVar260._28_4_;
                auVar260 = auVar50;
              }
switchD_002672a4_caseD_1:
              *(undefined1 (*) [32])local_238 = auVar260;
              local_238 = local_238 + 4;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 8) && (_elempack == 1)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        uVar94 = *(undefined4 *)(&this->field_0x114 + (long)p_Var70);
        local_128 = local_1c8.elemsize * local_1c8.cstep;
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar78 = uVar79;
        }
        uVar67 = local_1c8.w;
        if (local_1c8.w < 1) {
          uVar67 = 0;
        }
        uVar62 = local_1c8.h;
        if (local_1c8.h < 1) {
          uVar62 = 0;
        }
        local_120 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          local_120 = uVar79;
        }
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        local_130 = (Allocator *)local_1c8.data;
        iVar73 = bottom_blob->w;
        local_168._0_4_ = bottom_blob->h;
        for (; uVar79 != local_120; uVar79 = uVar79 + 1) {
          local_210 = (Allocator *)((long)&local_130->_vptr_Allocator + local_128 * uVar79);
          for (uVar74 = 0; uVar74 != uVar62; uVar74 = uVar74 + 1) {
            pfVar84 = *(float **)(&this->field_0x118 + (long)p_Var70);
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            pvVar59 = (this->weight_data_tm).data;
            iVar83 = (1 - uVar12) * iVar91;
            for (uVar77 = 0; uVar77 != uVar67; uVar77 = uVar77 + 1) {
              if (lVar75 == 0) {
                fVar93 = 0.0;
              }
              else {
                fVar93 = *(float *)(lVar75 + uVar79 * 4);
              }
              fVar132 = 0.0;
              fVar133 = 0.0;
              fVar99 = 0.0;
              fVar131 = 0.0;
              fVar134 = 0.0;
              fVar231 = 0.0;
              fVar233 = 0.0;
              fVar187 = 0.0;
              pvVar71 = (void *)(sVar16 * uVar79 * sVar17 + (long)pvVar59);
              for (uVar69 = 0; uVar69 != uVar78; uVar69 = uVar69 + 1) {
                pvVar61 = pvVar71;
                for (uVar82 = 0; uVar82 != uVar89; uVar82 = uVar82 + 1) {
                  iVar88 = (((int)uVar82 - uVar13) + 1) * iVar92 + uVar74;
                  if (((-1 < iVar88) && (iVar57 = iVar88 / iVar66, iVar88 % iVar66 == 0)) &&
                     (iVar57 < (int)local_168._0_4_)) {
                    iVar88 = iVar83;
                    for (lVar63 = 0; uVar68 * 0x20 != lVar63; lVar63 = lVar63 + 0x20) {
                      if (((-1 < iVar88) && (iVar54 = iVar88 / iVar72, iVar88 % iVar72 == 0)) &&
                         (iVar54 < iVar73)) {
                        pfVar65 = (float *)((long)pvVar61 + lVar63);
                        pfVar2 = (float *)((long)bottom_blob->data +
                                          (long)(iVar54 << 3) * 4 +
                                          (long)iVar57 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar69);
                        fVar99 = *pfVar65 * *pfVar2 + fVar99;
                        fVar131 = pfVar65[1] * pfVar2[1] + fVar131;
                        fVar132 = pfVar65[2] * pfVar2[2] + fVar132;
                        fVar133 = pfVar65[3] * pfVar2[3] + fVar133;
                        fVar134 = pfVar65[4] * pfVar2[4] + fVar134;
                        fVar231 = pfVar65[5] * pfVar2[5] + fVar231;
                        fVar233 = pfVar65[6] * pfVar2[6] + fVar233;
                        fVar187 = pfVar65[7] + fVar187;
                      }
                      iVar88 = iVar88 + iVar91;
                    }
                  }
                  pvVar61 = (void *)((long)pvVar61 + (long)(int)uVar12 * 0x20);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar12 * uVar13 * 8) * 4);
              }
              auVar105._0_4_ = fVar134 + fVar99;
              auVar105._4_4_ = fVar231 + fVar131;
              auVar105._8_4_ = fVar233 + fVar132;
              auVar105._12_4_ = fVar187 + fVar133;
              auVar188 = vshufpd_avx(auVar105,auVar105,1);
              auVar106._0_4_ = auVar188._0_4_ + auVar105._0_4_;
              auVar106._4_4_ = auVar188._4_4_ + auVar105._4_4_;
              auVar106._8_4_ = auVar188._8_4_ + auVar105._8_4_;
              auVar106._12_4_ = auVar188._12_4_ + auVar105._12_4_;
              auVar188 = vmovshdup_avx(auVar106);
              fVar93 = auVar188._0_4_ + fVar93 + auVar106._0_4_;
              auVar188 = ZEXT416((uint)fVar93);
              fVar132 = fVar93;
              switch(uVar94) {
              case 1:
                auVar188 = vmaxss_avx(ZEXT416((uint)fVar93),ZEXT416(0));
                fVar132 = auVar188._0_4_;
                break;
              case 2:
                auVar95._0_12_ = ZEXT812(0);
                auVar95._12_4_ = 0;
                auVar188 = vcmpss_avx(auVar95,auVar188,1);
                auVar150._8_4_ = 0x3f800000;
                auVar150._0_8_ = 0x3f8000003f800000;
                auVar150._12_4_ = 0x3f800000;
                auVar188 = vblendvps_avx(ZEXT416((uint)*pfVar84),auVar150,auVar188);
                fVar132 = auVar188._0_4_ * fVar93;
                break;
              case 3:
                auVar188 = vmaxss_avx(auVar188,ZEXT416((uint)*pfVar84));
                fVar132 = auVar188._0_4_;
                if (pfVar84[1] < auVar188._0_4_) {
                  fVar132 = pfVar84[1];
                }
                break;
              case 4:
                auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                auVar107._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                auVar107._8_4_ = auVar188._8_4_ ^ 0x80000000;
                auVar107._12_4_ = auVar188._12_4_ ^ 0x80000000;
                auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                auVar149._8_4_ = 0x42b0c0a5;
                auVar149._0_8_ = 0x42b0c0a542b0c0a5;
                auVar149._12_4_ = 0x42b0c0a5;
                auVar188 = vblendvps_avx(auVar107,auVar149,auVar188);
                fVar93 = expf(auVar188._0_4_);
                fVar132 = 1.0 / (fVar93 + 1.0);
                break;
              case 5:
                fVar132 = expf(fVar93);
                fVar132 = logf(fVar132 + 1.0);
                fVar132 = tanhf(fVar132);
                fVar132 = fVar132 * fVar93;
                break;
              case 6:
                fVar133 = *pfVar84;
                fVar99 = -pfVar84[1] / fVar133;
                fVar132 = 0.0;
                if ((fVar99 <= fVar93) && (fVar132 = fVar93, fVar93 <= fVar99 + 1.0 / fVar133)) {
                  fVar132 = (fVar133 * fVar93 + pfVar84[1]) * fVar93;
                }
              }
              *(float *)&local_210->_vptr_Allocator = fVar132;
              local_210 = (Allocator *)((long)&local_210->_vptr_Allocator + 4);
              iVar83 = iVar83 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 4) && (_elempack == 4)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar79;
        }
        auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar353 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar332 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar79 != uVar78; uVar79 = uVar79 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar79 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar69 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar69 = 0;
          }
          uVar62 = 0;
          uVar67 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar67 = 0;
          }
          uVar74 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar74 = 0;
          }
          for (; uVar62 != uVar74; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar77 = 0; uVar77 != uVar67; uVar77 = uVar77 + 1) {
              if (lVar75 == 0) {
                auVar188 = ZEXT816(0) << 0x40;
              }
              else {
                auVar188 = *(undefined1 (*) [16])(lVar75 + uVar79 * 0x10);
              }
              auVar306 = ZEXT1664(auVar188);
              lVar63 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar79 * (this->weight_data_tm).elemsize +
                       0x30;
              for (uVar82 = 0; uVar82 != uVar69; uVar82 = uVar82 + 1) {
                pvVar59 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar82 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar59;
                lVar64 = lVar63;
                for (uVar80 = 0; uVar80 != uVar89; uVar80 = uVar80 + 1) {
                  iVar54 = (((int)uVar80 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    lVar87 = (long)iVar55 * (long)bottom_blob->w * bottom_blob->elemsize;
                    iVar54 = iVar57;
                    for (lVar85 = 0; uVar68 * 0x40 != lVar85; lVar85 = lVar85 + 0x40) {
                      if (((-1 < iVar54) && (iVar55 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar55 < iVar83)) {
                        lVar60 = (long)(iVar55 << 2);
                        fVar93 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87);
                        fVar132 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 4);
                        fVar133 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 8);
                        fVar99 = *(float *)((long)pvVar59 + lVar60 * 4 + lVar87 + 0xc);
                        pfVar65 = (float *)(lVar64 + -0x30 + lVar85);
                        pfVar2 = (float *)(lVar64 + -0x20 + lVar85);
                        pfVar3 = (float *)(lVar64 + -0x10 + lVar85);
                        pfVar84 = (float *)(lVar64 + lVar85);
                        auVar306 = ZEXT1664(CONCAT412(fVar93 * pfVar65[3] + auVar306._12_4_ +
                                                      fVar132 * pfVar2[3] + fVar133 * pfVar3[3] +
                                                      fVar99 * pfVar84[3],
                                                      CONCAT48(fVar93 * pfVar65[2] + auVar306._8_4_
                                                               + fVar132 * pfVar2[2] +
                                                                 fVar133 * pfVar3[2] +
                                                               fVar99 * pfVar84[2],
                                                               CONCAT44(fVar93 * pfVar65[1] +
                                                                        auVar306._4_4_ +
                                                                        fVar132 * pfVar2[1] +
                                                                        fVar133 * pfVar3[1] +
                                                                        fVar99 * pfVar84[1],
                                                                        fVar93 * *pfVar65 +
                                                                        auVar306._0_4_ +
                                                                        fVar132 * *pfVar2 +
                                                                        fVar133 * *pfVar3 +
                                                                        fVar99 * *pfVar84))));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  lVar64 = lVar64 + (long)(int)uVar12 * 0x40;
                }
                lVar63 = lVar63 + (long)(int)(uVar12 * uVar13 * 0x10) * 4;
              }
              auVar188 = auVar306._0_16_;
              if (5 < iVar73 - 1U) goto LAB_00268430;
              auVar270 = auVar98._0_16_;
              auVar289 = vmaxps_avx(auVar188,auVar270);
              auVar100 = auVar332._0_16_;
              fVar132 = auVar353._4_4_;
              fVar99 = auVar353._8_4_;
              fVar231 = auVar353._12_4_;
              fVar226 = auVar353._0_4_;
              fVar93 = auVar332._0_4_;
              fVar133 = auVar332._4_4_;
              fVar131 = auVar332._8_4_;
              fVar134 = auVar332._12_4_;
              fVar233 = auVar306._8_4_;
              fVar187 = auVar306._12_4_;
              switch(iVar73) {
              case 2:
                auVar188 = vminps_avx(auVar188,auVar270);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar281._0_4_ = fVar93 * auVar188._0_4_ + auVar289._0_4_;
                auVar281._4_4_ = fVar93 * auVar188._4_4_ + auVar289._4_4_;
                auVar281._8_4_ = fVar93 * auVar188._8_4_ + auVar289._8_4_;
                auVar281._12_4_ = fVar93 * auVar188._12_4_ + auVar289._12_4_;
                auVar289 = auVar281;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar286._4_4_ = uVar94;
                auVar286._0_4_ = uVar94;
                auVar286._8_4_ = uVar94;
                auVar286._12_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar367._4_4_ = uVar94;
                auVar367._0_4_ = uVar94;
                auVar367._8_4_ = uVar94;
                auVar367._12_4_ = uVar94;
                auVar188 = vmaxps_avx(auVar188,auVar286);
                auVar289 = vminps_avx(auVar367,auVar188);
                break;
              case 4:
                auVar108._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                auVar108._8_4_ = -fVar233;
                auVar108._12_4_ = -fVar187;
                auVar156._8_4_ = 0x42b0c0a5;
                auVar156._0_8_ = 0x42b0c0a542b0c0a5;
                auVar156._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar108,auVar156);
                auVar157._8_4_ = 0xc2b0c0a5;
                auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar157._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar157);
                auVar287._0_4_ = fVar226 + auVar307._0_4_ * 1.442695;
                auVar287._4_4_ = fVar132 + auVar307._4_4_ * 1.442695;
                auVar287._8_4_ = fVar99 + auVar307._8_4_ * 1.442695;
                auVar287._12_4_ = fVar231 + auVar307._12_4_ * 1.442695;
                auVar368._0_4_ = (int)auVar287._0_4_;
                auVar368._4_4_ = (int)auVar287._4_4_;
                auVar368._8_4_ = (int)auVar287._8_4_;
                auVar368._12_4_ = (int)auVar287._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar368);
                auVar188 = vcmpps_avx(auVar287,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                fVar233 = auVar188._0_4_ * -0.6931472 + auVar307._0_4_;
                fVar187 = auVar188._4_4_ * -0.6931472 + auVar307._4_4_;
                fVar227 = auVar188._8_4_ * -0.6931472 + auVar307._8_4_;
                fVar228 = auVar188._12_4_ * -0.6931472 + auVar307._12_4_;
                auVar288._0_4_ = (int)auVar188._0_4_;
                auVar288._4_4_ = (int)auVar188._4_4_;
                auVar288._8_4_ = (int)auVar188._8_4_;
                auVar288._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar288,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar109._0_4_ =
                     (fVar233 * fVar233 *
                      (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) *
                         fVar233 + 0.041665796) * fVar233 + 0.16666666) * fVar233 + fVar226) +
                     fVar233 + fVar93) * auVar188._0_4_ + fVar93;
                auVar109._4_4_ =
                     (fVar187 * fVar187 *
                      (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                         fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar132) +
                     fVar187 + fVar133) * auVar188._4_4_ + fVar133;
                auVar109._8_4_ =
                     (fVar227 * fVar227 *
                      (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) *
                         fVar227 + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar99) +
                     fVar227 + fVar131) * auVar188._8_4_ + fVar131;
                auVar109._12_4_ =
                     (fVar228 * fVar228 *
                      (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) *
                         fVar228 + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar231) +
                     fVar228 + fVar134) * auVar188._12_4_ + fVar134;
                auVar188 = vrcpps_avx(auVar109);
                fVar93 = auVar188._0_4_;
                auVar110._0_4_ = auVar109._0_4_ * fVar93;
                fVar132 = auVar188._4_4_;
                auVar110._4_4_ = auVar109._4_4_ * fVar132;
                fVar133 = auVar188._8_4_;
                auVar110._8_4_ = auVar109._8_4_ * fVar133;
                fVar99 = auVar188._12_4_;
                auVar110._12_4_ = auVar109._12_4_ * fVar99;
                auVar188 = vsubps_avx(auVar100,auVar110);
                auVar289._0_4_ = fVar93 + fVar93 * auVar188._0_4_;
                auVar289._4_4_ = fVar132 + fVar132 * auVar188._4_4_;
                auVar289._8_4_ = fVar133 + fVar133 * auVar188._8_4_;
                auVar289._12_4_ = fVar99 + fVar99 * auVar188._12_4_;
                break;
              case 5:
                auVar236._8_4_ = 0x42b0c0a5;
                auVar236._0_8_ = 0x42b0c0a542b0c0a5;
                auVar236._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar236);
                auVar309._8_4_ = 0xc2b0c0a5;
                auVar309._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar309._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar309,auVar188);
                auVar350._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar350._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar350._8_4_ = auVar307._8_4_ * 1.442695 + fVar99;
                auVar350._12_4_ = auVar307._12_4_ * 1.442695 + fVar231;
                auVar365._0_4_ = (int)auVar350._0_4_;
                auVar365._4_4_ = (int)auVar350._4_4_;
                auVar365._8_4_ = (int)auVar350._8_4_;
                auVar365._12_4_ = (int)auVar350._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar365);
                auVar188 = vcmpps_avx(auVar350,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar366._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar366._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar366._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar366._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar270 = vsubps_avx(auVar307,auVar366);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar282._0_4_ = (int)auVar188._0_4_;
                auVar282._4_4_ = (int)auVar188._4_4_;
                auVar282._8_4_ = (int)auVar188._8_4_;
                auVar282._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar282,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar283._0_4_ =
                     (fVar227 + fVar93 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226)) * auVar188._0_4_
                     + fVar93;
                auVar283._4_4_ =
                     (fVar228 + fVar133 +
                     fVar228 * fVar228 *
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132)) * auVar188._4_4_
                     + fVar133;
                auVar283._8_4_ =
                     (fVar229 + fVar131 +
                     fVar229 * fVar229 *
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar99)) * auVar188._8_4_
                     + fVar131;
                auVar283._12_4_ =
                     (fVar230 + fVar134 +
                     fVar230 * fVar230 *
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar231)) *
                     auVar188._12_4_ + fVar134;
                auVar151._8_4_ = 0x800000;
                auVar151._0_8_ = 0x80000000800000;
                auVar151._12_4_ = 0x800000;
                auVar188 = vmaxps_avx(auVar283,auVar151);
                auVar270 = vpsrld_avx(auVar188,0x17);
                auVar199._8_4_ = 0xffffff82;
                auVar199._0_8_ = 0xffffff82ffffff82;
                auVar199._12_4_ = 0xffffff82;
                auVar270 = vpaddd_avx(auVar270,auVar199);
                auVar200._8_4_ = 0x807fffff;
                auVar200._0_8_ = 0x807fffff807fffff;
                auVar200._12_4_ = 0x807fffff;
                auVar188 = vandps_avx(auVar188,auVar200);
                auVar101 = vorps_avx(auVar188,auVar353._0_16_);
                auVar307 = vcvtdq2ps_avx(auVar270);
                auVar201._8_4_ = 0x3f3504f3;
                auVar201._0_8_ = 0x3f3504f33f3504f3;
                auVar201._12_4_ = 0x3f3504f3;
                auVar270 = vcmpps_avx(auVar101,auVar201,1);
                auVar188 = vandps_avx(auVar270,auVar101);
                fVar227 = auVar101._0_4_ + -1.0 + auVar188._0_4_;
                fVar228 = auVar101._4_4_ + -1.0 + auVar188._4_4_;
                fVar229 = auVar101._8_4_ + -1.0 + auVar188._8_4_;
                fVar230 = auVar101._12_4_ + -1.0 + auVar188._12_4_;
                auVar188 = vandps_avx(auVar270,auVar100);
                auVar270 = vsubps_avx(auVar307,auVar188);
                auVar188 = vcmpps_avx(auVar283,_DAT_004ee060,2);
                auVar152._0_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar270._0_4_ * 0.6931472 + fVar227) * -2.0;
                auVar152._4_4_ =
                     (fVar228 * fVar228 *
                      (((((((((fVar228 * 0.070376836 + -0.1151461) * fVar228 + 0.116769984) *
                             fVar228 + -0.12420141) * fVar228 + 0.14249323) * fVar228 + -0.16668057)
                          * fVar228 + 0.20000714) * fVar228 + -0.24999994) * fVar228 + 0.3333333) *
                       fVar228 + -0.5) + auVar270._4_4_ * 0.6931472 + fVar228) * -2.0;
                auVar152._8_4_ =
                     (fVar229 * fVar229 *
                      (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                             fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 + -0.16668057)
                          * fVar229 + 0.20000714) * fVar229 + -0.24999994) * fVar229 + 0.3333333) *
                       fVar229 + -0.5) + auVar270._8_4_ * 0.6931472 + fVar229) * -2.0;
                auVar152._12_4_ =
                     (fVar230 * fVar230 *
                      (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                             fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057)
                          * fVar230 + 0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) *
                       fVar230 + -0.5) + auVar270._12_4_ * 0.6931472 + fVar230) * -2.0;
                auVar202._8_4_ = 0x7fffffff;
                auVar202._0_8_ = 0x7fffffff7fffffff;
                auVar202._12_4_ = 0x7fffffff;
                auVar188 = vblendvps_avx(auVar152,auVar202,auVar188);
                auVar203._8_4_ = 0x42b0c0a5;
                auVar203._0_8_ = 0x42b0c0a542b0c0a5;
                auVar203._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar203);
                auVar204._8_4_ = 0xc2b0c0a5;
                auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar204._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar204);
                auVar205._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar205._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar205._8_4_ = auVar307._8_4_ * 1.442695 + fVar99;
                auVar205._12_4_ = auVar307._12_4_ * 1.442695 + fVar231;
                auVar284._0_4_ = (int)auVar205._0_4_;
                auVar284._4_4_ = (int)auVar205._4_4_;
                auVar284._8_4_ = (int)auVar205._8_4_;
                auVar284._12_4_ = (int)auVar205._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar284);
                auVar188 = vcmpps_avx(auVar205,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar285._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar285._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar285._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar285._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar332 = ZEXT1664(auVar100);
                auVar270 = vsubps_avx(auVar307,auVar285);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar98 = ZEXT864(0) << 0x20;
                auVar353 = ZEXT1664(auVar353._0_16_);
                auVar206._0_4_ = (int)auVar188._0_4_;
                auVar206._4_4_ = (int)auVar188._4_4_;
                auVar206._8_4_ = (int)auVar188._8_4_;
                auVar206._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar206,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar153._0_4_ =
                     (fVar227 + fVar93 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226) *
                     fVar227 * fVar227) * auVar188._0_4_ + fVar93;
                auVar153._4_4_ =
                     (fVar228 + fVar133 +
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132) *
                     fVar228 * fVar228) * auVar188._4_4_ + fVar133;
                auVar153._8_4_ =
                     (fVar229 + fVar131 +
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar99) *
                     fVar229 * fVar229) * auVar188._8_4_ + fVar131;
                auVar153._12_4_ =
                     (fVar230 + fVar134 +
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar231) *
                     fVar230 * fVar230) * auVar188._12_4_ + fVar134;
                auVar188 = vrcpps_avx(auVar153);
                fVar93 = auVar188._0_4_;
                fVar132 = auVar188._4_4_;
                fVar133 = auVar188._8_4_;
                fVar99 = auVar188._12_4_;
                auVar154._0_4_ = auVar153._0_4_ * (fVar93 + fVar93);
                auVar154._4_4_ = auVar153._4_4_ * (fVar132 + fVar132);
                auVar154._8_4_ = auVar153._8_4_ * (fVar133 + fVar133);
                auVar154._12_4_ = auVar153._12_4_ * (fVar99 + fVar99);
                auVar237._8_4_ = 0x40000000;
                auVar237._0_8_ = 0x4000000040000000;
                auVar237._12_4_ = 0x40000000;
                auVar188 = vsubps_avx(auVar237,auVar154);
                auVar155._0_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar188._0_4_;
                auVar155._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar188._4_4_;
                auVar155._8_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar188._8_4_;
                auVar155._12_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar188._12_4_;
                goto LAB_00268428;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar158._0_4_ = fVar93 * auVar306._0_4_ + fVar132;
                auVar158._4_4_ = fVar93 * auVar306._4_4_ + fVar132;
                auVar158._8_4_ = fVar93 * fVar233 + fVar132;
                auVar158._12_4_ = fVar93 * fVar187 + fVar132;
                auVar188 = vmaxps_avx(auVar158,auVar270);
                auVar155 = vminps_avx(auVar188,auVar100);
LAB_00268428:
                auVar289._0_4_ = auVar155._0_4_ * auVar306._0_4_;
                auVar289._4_4_ = auVar155._4_4_ * auVar306._4_4_;
                auVar289._8_4_ = auVar155._8_4_ * fVar233;
                auVar289._12_4_ = auVar155._12_4_ * fVar187;
              }
              auVar188 = auVar289;
LAB_00268430:
              *(undefined1 (*) [16])local_238 = auVar188;
              local_238 = local_238 + 2;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 1) && (_elempack == 4)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        iVar73 = *(int *)(&this->field_0x114 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          uVar78 = uVar79;
        }
        auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar353 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar332 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        for (; uVar79 != uVar78; uVar79 = uVar79 + 1) {
          local_238 = (Allocator *)
                      ((long)(_func_int ***)local_1c8.data +
                      local_1c8.cstep * uVar79 * local_1c8.elemsize);
          iVar83 = bottom_blob->w;
          iVar88 = bottom_blob->h;
          uVar62 = 0;
          uVar67 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar67 = uVar62;
          }
          uVar74 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar74 = 0;
          }
          uVar77 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar77 = 0;
          }
          for (; uVar62 != uVar77; uVar62 = uVar62 + 1) {
            iVar57 = (1 - uVar12) * iVar91;
            for (uVar81 = 0; uVar81 != uVar74; uVar81 = uVar81 + 1) {
              if (lVar75 == 0) {
                auVar188 = ZEXT816(0) << 0x40;
              }
              else {
                auVar188 = *(undefined1 (*) [16])(lVar75 + uVar79 * 0x10);
              }
              auVar306 = ZEXT1664(auVar188);
              pvVar59 = (void *)((this->weight_data_tm).cstep * uVar79 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar69 = 0; uVar69 != uVar67; uVar69 = uVar69 + 1) {
                pvVar61 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar69 +
                                  (long)bottom_blob->data);
                local_168._0_8_ = pvVar61;
                pvVar71 = pvVar59;
                for (uVar82 = 0; uVar82 != uVar89; uVar82 = uVar82 + 1) {
                  iVar54 = (((int)uVar82 - uVar13) + 1) * iVar92 + uVar62;
                  if (((-1 < iVar54) && (iVar55 = iVar54 / iVar66, iVar54 % iVar66 == 0)) &&
                     (iVar55 < iVar88)) {
                    iVar54 = iVar57;
                    for (lVar63 = 0; uVar68 * 0x10 != lVar63; lVar63 = lVar63 + 0x10) {
                      if (((-1 < iVar54) && (iVar56 = iVar54 / iVar72, iVar54 % iVar72 == 0)) &&
                         (iVar56 < iVar83)) {
                        fVar93 = *(float *)((long)pvVar61 +
                                           (long)iVar56 * 4 +
                                           (long)iVar55 *
                                           (long)bottom_blob->w * bottom_blob->elemsize);
                        pfVar84 = (float *)((long)pvVar71 + lVar63);
                        auVar306 = ZEXT1664(CONCAT412(fVar93 * pfVar84[3] + auVar306._12_4_,
                                                      CONCAT48(fVar93 * pfVar84[2] + auVar306._8_4_,
                                                               CONCAT44(fVar93 * pfVar84[1] +
                                                                        auVar306._4_4_,
                                                                        fVar93 * *pfVar84 +
                                                                        auVar306._0_4_))));
                      }
                      iVar54 = iVar54 + iVar91;
                    }
                  }
                  pvVar71 = (void *)((long)pvVar71 + (long)(int)uVar12 * 0x10);
                }
                pvVar59 = (void *)((long)pvVar59 + (long)(int)(uVar12 * uVar13 * 4) * 4);
              }
              auVar188 = auVar306._0_16_;
              auVar298 = auVar188;
              if (5 < iVar73 - 1U) goto switchD_002687d1_caseD_1;
              auVar270 = auVar98._0_16_;
              auVar298 = vmaxps_avx(auVar188,auVar270);
              auVar100 = auVar332._0_16_;
              fVar132 = auVar353._4_4_;
              fVar131 = auVar353._8_4_;
              fVar134 = auVar353._12_4_;
              fVar226 = auVar353._0_4_;
              fVar93 = auVar332._0_4_;
              fVar133 = auVar332._4_4_;
              fVar99 = auVar332._8_4_;
              fVar231 = auVar332._12_4_;
              fVar233 = auVar306._8_4_;
              fVar187 = auVar306._12_4_;
              switch(iVar73) {
              case 2:
                auVar188 = vminps_avx(auVar188,auVar270);
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                auVar290._0_4_ = fVar93 * auVar188._0_4_ + auVar298._0_4_;
                auVar290._4_4_ = fVar93 * auVar188._4_4_ + auVar298._4_4_;
                auVar290._8_4_ = fVar93 * auVar188._8_4_ + auVar298._8_4_;
                auVar290._12_4_ = fVar93 * auVar188._12_4_ + auVar298._12_4_;
                auVar298 = auVar290;
                break;
              case 3:
                uVar94 = **(undefined4 **)(&this->field_0x118 + (long)p_Var70);
                auVar295._4_4_ = uVar94;
                auVar295._0_4_ = uVar94;
                auVar295._8_4_ = uVar94;
                auVar295._12_4_ = uVar94;
                uVar94 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar371._4_4_ = uVar94;
                auVar371._0_4_ = uVar94;
                auVar371._8_4_ = uVar94;
                auVar371._12_4_ = uVar94;
                auVar188 = vmaxps_avx(auVar188,auVar295);
                auVar298 = vminps_avx(auVar371,auVar188);
                break;
              case 4:
                auVar111._0_8_ = auVar306._0_8_ ^ 0x8000000080000000;
                auVar111._8_4_ = -fVar233;
                auVar111._12_4_ = -fVar187;
                auVar164._8_4_ = 0x42b0c0a5;
                auVar164._0_8_ = 0x42b0c0a542b0c0a5;
                auVar164._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar111,auVar164);
                auVar165._8_4_ = 0xc2b0c0a5;
                auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar165._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar165);
                auVar296._0_4_ = fVar226 + auVar307._0_4_ * 1.442695;
                auVar296._4_4_ = fVar132 + auVar307._4_4_ * 1.442695;
                auVar296._8_4_ = fVar131 + auVar307._8_4_ * 1.442695;
                auVar296._12_4_ = fVar134 + auVar307._12_4_ * 1.442695;
                auVar372._0_4_ = (int)auVar296._0_4_;
                auVar372._4_4_ = (int)auVar296._4_4_;
                auVar372._8_4_ = (int)auVar296._8_4_;
                auVar372._12_4_ = (int)auVar296._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar372);
                auVar188 = vcmpps_avx(auVar296,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                fVar233 = auVar188._0_4_ * -0.6931472 + auVar307._0_4_;
                fVar187 = auVar188._4_4_ * -0.6931472 + auVar307._4_4_;
                fVar227 = auVar188._8_4_ * -0.6931472 + auVar307._8_4_;
                fVar228 = auVar188._12_4_ * -0.6931472 + auVar307._12_4_;
                auVar297._0_4_ = (int)auVar188._0_4_;
                auVar297._4_4_ = (int)auVar188._4_4_;
                auVar297._8_4_ = (int)auVar188._8_4_;
                auVar297._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar297,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar112._0_4_ =
                     (fVar233 * fVar233 *
                      (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) *
                         fVar233 + 0.041665796) * fVar233 + 0.16666666) * fVar233 + fVar226) +
                     fVar233 + fVar93) * auVar188._0_4_ + fVar93;
                auVar112._4_4_ =
                     (fVar187 * fVar187 *
                      (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                         fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar132) +
                     fVar187 + fVar133) * auVar188._4_4_ + fVar133;
                auVar112._8_4_ =
                     (fVar227 * fVar227 *
                      (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) *
                         fVar227 + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar131) +
                     fVar227 + fVar99) * auVar188._8_4_ + fVar99;
                auVar112._12_4_ =
                     (fVar228 * fVar228 *
                      (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) *
                         fVar228 + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar134) +
                     fVar228 + fVar231) * auVar188._12_4_ + fVar231;
                auVar188 = vrcpps_avx(auVar112);
                fVar93 = auVar188._0_4_;
                auVar113._0_4_ = auVar112._0_4_ * fVar93;
                fVar132 = auVar188._4_4_;
                auVar113._4_4_ = auVar112._4_4_ * fVar132;
                fVar133 = auVar188._8_4_;
                auVar113._8_4_ = auVar112._8_4_ * fVar133;
                fVar99 = auVar188._12_4_;
                auVar113._12_4_ = auVar112._12_4_ * fVar99;
                auVar188 = vsubps_avx(auVar100,auVar113);
                auVar298._0_4_ = fVar93 + fVar93 * auVar188._0_4_;
                auVar298._4_4_ = fVar132 + fVar132 * auVar188._4_4_;
                auVar298._8_4_ = fVar133 + fVar133 * auVar188._8_4_;
                auVar298._12_4_ = fVar99 + fVar99 * auVar188._12_4_;
                break;
              case 5:
                auVar238._8_4_ = 0x42b0c0a5;
                auVar238._0_8_ = 0x42b0c0a542b0c0a5;
                auVar238._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar238);
                auVar310._8_4_ = 0xc2b0c0a5;
                auVar310._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar310._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar310,auVar188);
                auVar351._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar351._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar351._8_4_ = auVar307._8_4_ * 1.442695 + fVar131;
                auVar351._12_4_ = auVar307._12_4_ * 1.442695 + fVar134;
                auVar369._0_4_ = (int)auVar351._0_4_;
                auVar369._4_4_ = (int)auVar351._4_4_;
                auVar369._8_4_ = (int)auVar351._8_4_;
                auVar369._12_4_ = (int)auVar351._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar369);
                auVar188 = vcmpps_avx(auVar351,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar370._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar370._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar370._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar370._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar270 = vsubps_avx(auVar307,auVar370);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar291._0_4_ = (int)auVar188._0_4_;
                auVar291._4_4_ = (int)auVar188._4_4_;
                auVar291._8_4_ = (int)auVar188._8_4_;
                auVar291._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar291,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar292._0_4_ =
                     (fVar227 + fVar93 +
                     fVar227 * fVar227 *
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226)) * auVar188._0_4_
                     + fVar93;
                auVar292._4_4_ =
                     (fVar228 + fVar133 +
                     fVar228 * fVar228 *
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132)) * auVar188._4_4_
                     + fVar133;
                auVar292._8_4_ =
                     (fVar229 + fVar99 +
                     fVar229 * fVar229 *
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar131)) * auVar188._8_4_
                     + fVar99;
                auVar292._12_4_ =
                     (fVar230 + fVar231 +
                     fVar230 * fVar230 *
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar134)) *
                     auVar188._12_4_ + fVar231;
                auVar159._8_4_ = 0x800000;
                auVar159._0_8_ = 0x80000000800000;
                auVar159._12_4_ = 0x800000;
                auVar188 = vmaxps_avx(auVar292,auVar159);
                auVar270 = vpsrld_avx(auVar188,0x17);
                auVar207._8_4_ = 0xffffff82;
                auVar207._0_8_ = 0xffffff82ffffff82;
                auVar207._12_4_ = 0xffffff82;
                auVar270 = vpaddd_avx(auVar270,auVar207);
                auVar208._8_4_ = 0x807fffff;
                auVar208._0_8_ = 0x807fffff807fffff;
                auVar208._12_4_ = 0x807fffff;
                auVar188 = vandps_avx(auVar188,auVar208);
                auVar101 = vorps_avx(auVar188,auVar353._0_16_);
                auVar307 = vcvtdq2ps_avx(auVar270);
                auVar209._8_4_ = 0x3f3504f3;
                auVar209._0_8_ = 0x3f3504f33f3504f3;
                auVar209._12_4_ = 0x3f3504f3;
                auVar270 = vcmpps_avx(auVar101,auVar209,1);
                auVar188 = vandps_avx(auVar270,auVar101);
                fVar227 = auVar101._0_4_ + -1.0 + auVar188._0_4_;
                fVar228 = auVar101._4_4_ + -1.0 + auVar188._4_4_;
                fVar229 = auVar101._8_4_ + -1.0 + auVar188._8_4_;
                fVar230 = auVar101._12_4_ + -1.0 + auVar188._12_4_;
                auVar188 = vandps_avx(auVar270,auVar100);
                auVar270 = vsubps_avx(auVar307,auVar188);
                auVar188 = vcmpps_avx(auVar292,_DAT_004ee060,2);
                auVar160._0_4_ =
                     (fVar227 * fVar227 *
                      (((((((((fVar227 * 0.070376836 + -0.1151461) * fVar227 + 0.116769984) *
                             fVar227 + -0.12420141) * fVar227 + 0.14249323) * fVar227 + -0.16668057)
                          * fVar227 + 0.20000714) * fVar227 + -0.24999994) * fVar227 + 0.3333333) *
                       fVar227 + -0.5) + auVar270._0_4_ * 0.6931472 + fVar227) * -2.0;
                auVar160._4_4_ =
                     (fVar228 * fVar228 *
                      (((((((((fVar228 * 0.070376836 + -0.1151461) * fVar228 + 0.116769984) *
                             fVar228 + -0.12420141) * fVar228 + 0.14249323) * fVar228 + -0.16668057)
                          * fVar228 + 0.20000714) * fVar228 + -0.24999994) * fVar228 + 0.3333333) *
                       fVar228 + -0.5) + auVar270._4_4_ * 0.6931472 + fVar228) * -2.0;
                auVar160._8_4_ =
                     (fVar229 * fVar229 *
                      (((((((((fVar229 * 0.070376836 + -0.1151461) * fVar229 + 0.116769984) *
                             fVar229 + -0.12420141) * fVar229 + 0.14249323) * fVar229 + -0.16668057)
                          * fVar229 + 0.20000714) * fVar229 + -0.24999994) * fVar229 + 0.3333333) *
                       fVar229 + -0.5) + auVar270._8_4_ * 0.6931472 + fVar229) * -2.0;
                auVar160._12_4_ =
                     (fVar230 * fVar230 *
                      (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                             fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057)
                          * fVar230 + 0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) *
                       fVar230 + -0.5) + auVar270._12_4_ * 0.6931472 + fVar230) * -2.0;
                auVar210._8_4_ = 0x7fffffff;
                auVar210._0_8_ = 0x7fffffff7fffffff;
                auVar210._12_4_ = 0x7fffffff;
                auVar188 = vblendvps_avx(auVar160,auVar210,auVar188);
                auVar211._8_4_ = 0x42b0c0a5;
                auVar211._0_8_ = 0x42b0c0a542b0c0a5;
                auVar211._12_4_ = 0x42b0c0a5;
                auVar188 = vminps_avx(auVar188,auVar211);
                auVar212._8_4_ = 0xc2b0c0a5;
                auVar212._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar212._12_4_ = 0xc2b0c0a5;
                auVar307 = vmaxps_avx(auVar188,auVar212);
                auVar213._0_4_ = auVar307._0_4_ * 1.442695 + fVar226;
                auVar213._4_4_ = auVar307._4_4_ * 1.442695 + fVar132;
                auVar213._8_4_ = auVar307._8_4_ * 1.442695 + fVar131;
                auVar213._12_4_ = auVar307._12_4_ * 1.442695 + fVar134;
                auVar293._0_4_ = (int)auVar213._0_4_;
                auVar293._4_4_ = (int)auVar213._4_4_;
                auVar293._8_4_ = (int)auVar213._8_4_;
                auVar293._12_4_ = (int)auVar213._12_4_;
                auVar270 = vcvtdq2ps_avx(auVar293);
                auVar188 = vcmpps_avx(auVar213,auVar270,1);
                auVar188 = vandps_avx(auVar188,auVar100);
                auVar188 = vsubps_avx(auVar270,auVar188);
                auVar294._0_4_ = auVar188._0_4_ * 0.6931472;
                auVar294._4_4_ = auVar188._4_4_ * 0.6931472;
                auVar294._8_4_ = auVar188._8_4_ * 0.6931472;
                auVar294._12_4_ = auVar188._12_4_ * 0.6931472;
                auVar332 = ZEXT1664(auVar100);
                auVar270 = vsubps_avx(auVar307,auVar294);
                fVar227 = auVar270._0_4_;
                fVar228 = auVar270._4_4_;
                fVar229 = auVar270._8_4_;
                fVar230 = auVar270._12_4_;
                auVar98 = ZEXT864(0) << 0x20;
                auVar353 = ZEXT1664(auVar353._0_16_);
                auVar214._0_4_ = (int)auVar188._0_4_;
                auVar214._4_4_ = (int)auVar188._4_4_;
                auVar214._8_4_ = (int)auVar188._8_4_;
                auVar214._12_4_ = (int)auVar188._12_4_;
                auVar188 = vpslld_avx(auVar214,0x17);
                auVar188 = vpaddd_avx(auVar188,auVar100);
                auVar161._0_4_ =
                     (fVar227 + fVar93 +
                     (((((fVar227 * 0.00019875691 + 0.0013981999) * fVar227 + 0.008333452) * fVar227
                       + 0.041665796) * fVar227 + 0.16666666) * fVar227 + fVar226) *
                     fVar227 * fVar227) * auVar188._0_4_ + fVar93;
                auVar161._4_4_ =
                     (fVar228 + fVar133 +
                     (((((fVar228 * 0.00019875691 + 0.0013981999) * fVar228 + 0.008333452) * fVar228
                       + 0.041665796) * fVar228 + 0.16666666) * fVar228 + fVar132) *
                     fVar228 * fVar228) * auVar188._4_4_ + fVar133;
                auVar161._8_4_ =
                     (fVar229 + fVar99 +
                     (((((fVar229 * 0.00019875691 + 0.0013981999) * fVar229 + 0.008333452) * fVar229
                       + 0.041665796) * fVar229 + 0.16666666) * fVar229 + fVar131) *
                     fVar229 * fVar229) * auVar188._8_4_ + fVar99;
                auVar161._12_4_ =
                     (fVar230 + fVar231 +
                     (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230
                       + 0.041665796) * fVar230 + 0.16666666) * fVar230 + fVar134) *
                     fVar230 * fVar230) * auVar188._12_4_ + fVar231;
                auVar188 = vrcpps_avx(auVar161);
                fVar93 = auVar188._0_4_;
                fVar132 = auVar188._4_4_;
                fVar133 = auVar188._8_4_;
                fVar99 = auVar188._12_4_;
                auVar162._0_4_ = auVar161._0_4_ * (fVar93 + fVar93);
                auVar162._4_4_ = auVar161._4_4_ * (fVar132 + fVar132);
                auVar162._8_4_ = auVar161._8_4_ * (fVar133 + fVar133);
                auVar162._12_4_ = auVar161._12_4_ * (fVar99 + fVar99);
                auVar239._8_4_ = 0x40000000;
                auVar239._0_8_ = 0x4000000040000000;
                auVar239._12_4_ = 0x40000000;
                auVar188 = vsubps_avx(auVar239,auVar162);
                auVar163._0_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar188._0_4_;
                auVar163._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar188._4_4_;
                auVar163._8_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar188._8_4_;
                auVar163._12_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar188._12_4_;
                goto LAB_00268bfe;
              case 6:
                fVar93 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar132 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar166._0_4_ = fVar93 * auVar306._0_4_ + fVar132;
                auVar166._4_4_ = fVar93 * auVar306._4_4_ + fVar132;
                auVar166._8_4_ = fVar93 * fVar233 + fVar132;
                auVar166._12_4_ = fVar93 * fVar187 + fVar132;
                auVar188 = vmaxps_avx(auVar166,auVar270);
                auVar163 = vminps_avx(auVar188,auVar100);
LAB_00268bfe:
                auVar298._0_4_ = auVar163._0_4_ * auVar306._0_4_;
                auVar298._4_4_ = auVar163._4_4_ * auVar306._4_4_;
                auVar298._8_4_ = auVar163._8_4_ * fVar233;
                auVar298._12_4_ = auVar163._12_4_ * fVar187;
              }
switchD_002687d1_caseD_1:
              *(undefined1 (*) [16])local_238 = auVar298;
              local_238 = local_238 + 2;
              iVar57 = iVar57 + 1;
            }
          }
        }
      }
      if (((int)local_180 == 4) && (_elempack == 1)) {
        p_Var70 = local_170[-3];
        uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var70);
        uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var70);
        iVar91 = *(int *)(&this->field_0xdc + (long)p_Var70);
        uVar94 = *(undefined4 *)(&this->field_0x114 + (long)p_Var70);
        local_128 = local_1c8.elemsize * local_1c8.cstep;
        uVar79 = 0;
        uVar68 = 0;
        if (0 < (int)uVar12) {
          uVar68 = (ulong)uVar12;
        }
        uVar89 = 0;
        if (0 < (int)uVar13) {
          uVar89 = (ulong)uVar13;
        }
        uVar78 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar78 = uVar79;
        }
        uVar67 = local_1c8.w;
        if (local_1c8.w < 1) {
          uVar67 = 0;
        }
        uVar62 = local_1c8.h;
        if (local_1c8.h < 1) {
          uVar62 = 0;
        }
        local_120 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          local_120 = uVar79;
        }
        iVar92 = *(int *)(&this->field_0xe0 + (long)p_Var70);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var70);
        iVar66 = *(int *)(&this->field_0xe8 + (long)p_Var70);
        lVar75 = *(long *)(&this->field_0x1a8 + (long)p_Var70);
        local_130 = (Allocator *)local_1c8.data;
        iVar73 = bottom_blob->w;
        local_168._0_4_ = bottom_blob->h;
        for (; uVar79 != local_120; uVar79 = uVar79 + 1) {
          local_210 = (Allocator *)((long)&local_130->_vptr_Allocator + local_128 * uVar79);
          for (uVar74 = 0; uVar74 != uVar62; uVar74 = uVar74 + 1) {
            pfVar84 = *(float **)(&this->field_0x118 + (long)p_Var70);
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            pvVar59 = (this->weight_data_tm).data;
            iVar83 = (1 - uVar12) * iVar91;
            for (uVar77 = 0; uVar77 != uVar67; uVar77 = uVar77 + 1) {
              if (lVar75 == 0) {
                fVar93 = 0.0;
              }
              else {
                fVar93 = *(float *)(lVar75 + uVar79 * 4);
              }
              auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar71 = (void *)(sVar16 * uVar79 * sVar17 + (long)pvVar59);
              for (uVar69 = 0; uVar69 != uVar78; uVar69 = uVar69 + 1) {
                pvVar61 = pvVar71;
                for (uVar82 = 0; uVar82 != uVar89; uVar82 = uVar82 + 1) {
                  iVar88 = (((int)uVar82 - uVar13) + 1) * iVar92 + uVar74;
                  if (((-1 < iVar88) && (iVar57 = iVar88 / iVar66, iVar88 % iVar66 == 0)) &&
                     (iVar57 < (int)local_168._0_4_)) {
                    iVar88 = iVar83;
                    for (lVar63 = 0; uVar68 * 0x10 != lVar63; lVar63 = lVar63 + 0x10) {
                      if (((-1 < iVar88) && (iVar54 = iVar88 / iVar72, iVar88 % iVar72 == 0)) &&
                         (iVar54 < iVar73)) {
                        pfVar65 = (float *)((long)pvVar61 + lVar63);
                        pfVar2 = (float *)((long)bottom_blob->data +
                                          (long)(iVar54 << 2) * 4 +
                                          (long)iVar57 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar69);
                        auVar98 = ZEXT1664(CONCAT412(pfVar65[3] * pfVar2[3] + auVar98._12_4_,
                                                     CONCAT48(pfVar65[2] * pfVar2[2] + auVar98._8_4_
                                                              ,CONCAT44(pfVar65[1] * pfVar2[1] +
                                                                        auVar98._4_4_,
                                                                        *pfVar65 * *pfVar2 +
                                                                        auVar98._0_4_))));
                      }
                      iVar88 = iVar88 + iVar91;
                    }
                  }
                  pvVar61 = (void *)((long)pvVar61 + (long)(int)uVar12 * 0x10);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar12 * uVar13 * 4) * 4);
              }
              auVar188 = vshufpd_avx(auVar98._0_16_,auVar98._0_16_,1);
              auVar114._0_4_ = auVar188._0_4_ + auVar98._0_4_;
              auVar114._4_4_ = auVar188._4_4_ + auVar98._4_4_;
              auVar114._8_4_ = auVar188._8_4_ + auVar98._8_4_;
              auVar114._12_4_ = auVar188._12_4_ + auVar98._12_4_;
              auVar188 = vmovshdup_avx(auVar114);
              fVar93 = auVar188._0_4_ + fVar93 + auVar114._0_4_;
              auVar188 = ZEXT416((uint)fVar93);
              fVar132 = fVar93;
              switch(uVar94) {
              case 1:
                auVar188 = vmaxss_avx(ZEXT416((uint)fVar93),ZEXT416(0));
                fVar132 = auVar188._0_4_;
                break;
              case 2:
                auVar96._0_12_ = ZEXT812(0);
                auVar96._12_4_ = 0;
                auVar188 = vcmpss_avx(auVar96,auVar188,1);
                auVar168._8_4_ = 0x3f800000;
                auVar168._0_8_ = 0x3f8000003f800000;
                auVar168._12_4_ = 0x3f800000;
                auVar188 = vblendvps_avx(ZEXT416((uint)*pfVar84),auVar168,auVar188);
                fVar132 = auVar188._0_4_ * fVar93;
                break;
              case 3:
                auVar188 = vmaxss_avx(auVar188,ZEXT416((uint)*pfVar84));
                fVar132 = auVar188._0_4_;
                if (pfVar84[1] < auVar188._0_4_) {
                  fVar132 = pfVar84[1];
                }
                break;
              case 4:
                auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                auVar115._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                auVar115._8_4_ = auVar188._8_4_ ^ 0x80000000;
                auVar115._12_4_ = auVar188._12_4_ ^ 0x80000000;
                auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                auVar167._8_4_ = 0x42b0c0a5;
                auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                auVar167._12_4_ = 0x42b0c0a5;
                auVar188 = vblendvps_avx(auVar115,auVar167,auVar188);
                fVar93 = expf(auVar188._0_4_);
                fVar132 = 1.0 / (fVar93 + 1.0);
                break;
              case 5:
                fVar132 = expf(fVar93);
                fVar132 = logf(fVar132 + 1.0);
                fVar132 = tanhf(fVar132);
                fVar132 = fVar132 * fVar93;
                break;
              case 6:
                fVar133 = *pfVar84;
                fVar99 = -pfVar84[1] / fVar133;
                fVar132 = 0.0;
                if ((fVar99 <= fVar93) && (fVar132 = fVar93, fVar93 <= fVar99 + 1.0 / fVar133)) {
                  fVar132 = (fVar133 * fVar93 + pfVar84[1]) * fVar93;
                }
              }
              *(float *)&local_210->_vptr_Allocator = fVar132;
              local_210 = (Allocator *)((long)&local_210->_vptr_Allocator + 4);
              iVar83 = iVar83 + 1;
            }
          }
        }
      }
      pvVar59 = local_1c8.data;
      if (((int)local_180 == 1) && (_elempack == 1)) {
        pp_Var15 = this->_vptr_Deconvolution_x86_avx;
        lVar75 = local_1c8.cstep * local_1c8.elemsize;
        iVar91 = bottom_blob->w;
        iVar92 = bottom_blob->h;
        lVar63 = (long)local_1c8.w;
        uVar79 = 0;
        uVar68 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar68 = uVar79;
        }
        uVar89 = 0;
        if (0 < local_1c8.w) {
          uVar89 = (ulong)(uint)local_1c8.w;
        }
        uVar78 = (ulong)(uint)local_1c8.h;
        if (local_1c8.h < 1) {
          uVar78 = uVar79;
        }
        local_140 = local_140 << 2;
        for (; (long)uVar79 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var15[-3]);
            uVar79 = uVar79 + 1) {
          local_218 = (Allocator *)((long)(_func_int ***)pvVar59 + lVar75 * uVar79);
          for (iVar72 = 0; iVar72 != (int)uVar78; iVar72 = iVar72 + 1) {
            pp_Var18 = this->_vptr_Deconvolution_x86_avx;
            sVar16 = (this->weight_data_tm).cstep;
            sVar17 = (this->weight_data_tm).elemsize;
            iVar66 = iVar72 - local_178;
            pvVar71 = (this->weight_data_tm).data;
            for (uVar69 = 0; uVar69 != uVar89; uVar69 = uVar69 + 1) {
              p_Var70 = pp_Var18[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var70) == 0) {
                auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar98 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var70) +
                                           uVar79 * 4));
              }
              pvVar61 = (void *)(sVar16 * uVar79 * sVar17 + (long)pvVar71);
              for (uVar82 = 0; uVar82 != uVar68; uVar82 = uVar82 + 1) {
                local_168._0_8_ = uVar82;
                p_Var19 = this->_vptr_Deconvolution_x86_avx[-3];
                iVar83 = 0;
                iVar73 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                if (*(int *)(&this->field_0xd8 + (long)p_Var19) < 1) {
                  iVar73 = iVar83;
                }
                for (; iVar83 != iVar73; iVar83 = iVar83 + 1) {
                  iVar88 = *(int *)(&this->field_0xe0 + (long)p_Var19) * iVar83 + iVar66;
                  if (((-1 < iVar88) &&
                      (iVar57 = iVar88 / *(int *)(&this->field_0xe8 + (long)p_Var19),
                      iVar88 % *(int *)(&this->field_0xe8 + (long)p_Var19) == 0)) &&
                     (iVar57 < iVar92)) {
                    uVar12 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
                    uVar80 = 0;
                    if (0 < (int)uVar12) {
                      uVar80 = (ulong)uVar12;
                    }
                    for (uVar76 = 0; uVar80 != uVar76; uVar76 = uVar76 + 1) {
                      iVar88 = *(int *)(&this->field_0xdc + (long)p_Var19) * (int)uVar76 +
                               ((int)uVar69 - local_174);
                      if (((-1 < iVar88) &&
                          (iVar54 = iVar88 / *(int *)(&this->field_0xe4 + (long)p_Var19),
                          iVar88 % *(int *)(&this->field_0xe4 + (long)p_Var19) == 0)) &&
                         (iVar54 < iVar91)) {
                        auVar98 = ZEXT464((uint)(*(float *)((long)pvVar61 +
                                                           uVar76 * 4 +
                                                           (long)(int)(uVar12 * iVar83) * 4) *
                                                 *(float *)((long)bottom_blob->data +
                                                           (long)iVar54 * 4 +
                                                           (long)iVar57 *
                                                           (long)bottom_blob->w *
                                                           bottom_blob->elemsize +
                                                           bottom_blob->cstep *
                                                           bottom_blob->elemsize * uVar82) +
                                                auVar98._0_4_));
                      }
                    }
                  }
                }
                pvVar61 = (void *)((long)pvVar61 + local_140);
              }
              auVar188 = auVar98._0_16_;
              fVar132 = auVar98._0_4_;
              fVar93 = fVar132;
              switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var70)) {
              case 1:
                auVar188 = vmaxss_avx(auVar188,ZEXT416(0));
                fVar93 = auVar188._0_4_;
                break;
              case 2:
                auVar188 = vcmpss_avx(ZEXT816(0) << 0x40,auVar188,1);
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar188 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var70)),
                                         auVar170,auVar188);
                fVar99 = auVar188._0_4_;
LAB_002694d4:
                fVar93 = fVar99 * fVar132;
                break;
              case 3:
                fVar132 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var70))[1];
                auVar188 = vmaxss_avx(auVar188,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var70)));
                fVar93 = auVar188._0_4_;
                if (fVar132 < auVar188._0_4_) {
                  fVar93 = fVar132;
                }
                break;
              case 4:
                auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                auVar116._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                auVar116._8_4_ = auVar188._8_4_ ^ 0x80000000;
                auVar116._12_4_ = auVar188._12_4_ ^ 0x80000000;
                auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                auVar169._8_4_ = 0x42b0c0a5;
                auVar169._0_8_ = 0x42b0c0a542b0c0a5;
                auVar169._12_4_ = 0x42b0c0a5;
                auVar188 = vblendvps_avx(auVar116,auVar169,auVar188);
                fVar93 = expf(auVar188._0_4_);
                fVar93 = 1.0 / (fVar93 + 1.0);
                break;
              case 5:
                fVar93 = expf(fVar132);
                fVar93 = logf(fVar93 + 1.0);
                fVar93 = tanhf(fVar93);
                fVar93 = fVar93 * fVar132;
                break;
              case 6:
                fVar133 = **(float **)(&this->field_0x118 + (long)p_Var70);
                fVar99 = (*(float **)(&this->field_0x118 + (long)p_Var70))[1];
                fVar131 = -fVar99 / fVar133;
                fVar93 = 0.0;
                if ((fVar131 <= fVar132) && (fVar93 = fVar132, fVar132 <= fVar131 + 1.0 / fVar133))
                {
                  fVar99 = fVar133 * fVar132 + fVar99;
                  goto LAB_002694d4;
                }
              }
              *(float *)((long)&local_218->_vptr_Allocator + uVar69 * 4) = fVar93;
            }
            local_218 = (Allocator *)((long)&local_218->_vptr_Allocator + lVar63 * 4);
          }
        }
      }
    }
    pMVar53 = local_138;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_avx +
               (long)this->_vptr_Deconvolution_x86_avx[-3]),&local_1c8,local_138,local_148);
    if ((pMVar53->data == (void *)0x0) || (iVar72 = 0, (long)pMVar53->c * pMVar53->cstep == 0)) {
      iVar72 = -100;
    }
  }
  piVar14 = (int *)CONCAT44(local_1c8.refcount._4_4_,(int)local_1c8.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        free(local_1c8.data);
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar72;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}